

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  ulong uVar79;
  int iVar80;
  ulong uVar81;
  uint uVar82;
  long lVar83;
  byte bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar152;
  uint uVar153;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar155;
  uint uVar156;
  uint uVar157;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  uint uVar154;
  uint uVar158;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  float fVar159;
  float fVar178;
  vint4 bi_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar179;
  vint4 bi_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar182 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  vint4 bi;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar235;
  float fVar236;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar237;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar247;
  float fVar248;
  vint4 ai_2;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar249;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  undefined1 auVar246 [32];
  vint4 ai;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  vint4 ai_1;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float fVar266;
  float fVar272;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar270;
  float fVar271;
  undefined1 auVar269 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  float s;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 (*local_a68) [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar1 = prim[1];
  uVar81 = (ulong)(byte)PVar1;
  fVar218 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar219._0_4_ = fVar218 * auVar92._0_4_;
  auVar219._4_4_ = fVar218 * auVar92._4_4_;
  auVar219._8_4_ = fVar218 * auVar92._8_4_;
  auVar219._12_4_ = fVar218 * auVar92._12_4_;
  auVar99._0_4_ = fVar218 * auVar90._0_4_;
  auVar99._4_4_ = fVar218 * auVar90._4_4_;
  auVar99._8_4_ = fVar218 * auVar90._8_4_;
  auVar99._12_4_ = fVar218 * auVar90._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar81 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar79 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar81 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar85 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar280._4_4_ = auVar99._0_4_;
  auVar280._0_4_ = auVar99._0_4_;
  auVar280._8_4_ = auVar99._0_4_;
  auVar280._12_4_ = auVar99._0_4_;
  auVar98 = vshufps_avx(auVar99,auVar99,0x55);
  auVar91 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar218 = auVar91._0_4_;
  auVar201._0_4_ = fVar218 * auVar93._0_4_;
  fVar178 = auVar91._4_4_;
  auVar201._4_4_ = fVar178 * auVar93._4_4_;
  fVar235 = auVar91._8_4_;
  auVar201._8_4_ = fVar235 * auVar93._8_4_;
  fVar236 = auVar91._12_4_;
  auVar201._12_4_ = fVar236 * auVar93._12_4_;
  auVar180._0_4_ = auVar94._0_4_ * fVar218;
  auVar180._4_4_ = auVar94._4_4_ * fVar178;
  auVar180._8_4_ = auVar94._8_4_ * fVar235;
  auVar180._12_4_ = auVar94._12_4_ * fVar236;
  auVar160._0_4_ = auVar97._0_4_ * fVar218;
  auVar160._4_4_ = auVar97._4_4_ * fVar178;
  auVar160._8_4_ = auVar97._8_4_ * fVar235;
  auVar160._12_4_ = auVar97._12_4_ * fVar236;
  auVar91 = vfmadd231ps_fma(auVar201,auVar98,auVar90);
  auVar89 = vfmadd231ps_fma(auVar180,auVar98,auVar20);
  auVar98 = vfmadd231ps_fma(auVar160,auVar96,auVar98);
  auVar88 = vfmadd231ps_fma(auVar91,auVar280,auVar92);
  auVar89 = vfmadd231ps_fma(auVar89,auVar280,auVar95);
  auVar99 = vfmadd231ps_fma(auVar98,auVar100,auVar280);
  auVar281._4_4_ = auVar219._0_4_;
  auVar281._0_4_ = auVar219._0_4_;
  auVar281._8_4_ = auVar219._0_4_;
  auVar281._12_4_ = auVar219._0_4_;
  auVar98 = vshufps_avx(auVar219,auVar219,0x55);
  auVar91 = vshufps_avx(auVar219,auVar219,0xaa);
  fVar218 = auVar91._0_4_;
  auVar284._0_4_ = fVar218 * auVar93._0_4_;
  fVar178 = auVar91._4_4_;
  auVar284._4_4_ = fVar178 * auVar93._4_4_;
  fVar235 = auVar91._8_4_;
  auVar284._8_4_ = fVar235 * auVar93._8_4_;
  fVar236 = auVar91._12_4_;
  auVar284._12_4_ = fVar236 * auVar93._12_4_;
  auVar242._0_4_ = auVar94._0_4_ * fVar218;
  auVar242._4_4_ = auVar94._4_4_ * fVar178;
  auVar242._8_4_ = auVar94._8_4_ * fVar235;
  auVar242._12_4_ = auVar94._12_4_ * fVar236;
  auVar220._0_4_ = auVar97._0_4_ * fVar218;
  auVar220._4_4_ = auVar97._4_4_ * fVar178;
  auVar220._8_4_ = auVar97._8_4_ * fVar235;
  auVar220._12_4_ = auVar97._12_4_ * fVar236;
  auVar90 = vfmadd231ps_fma(auVar284,auVar98,auVar90);
  auVar93 = vfmadd231ps_fma(auVar242,auVar98,auVar20);
  auVar20 = vfmadd231ps_fma(auVar220,auVar98,auVar96);
  auVar94 = vfmadd231ps_fma(auVar90,auVar281,auVar92);
  auVar96 = vfmadd231ps_fma(auVar93,auVar281,auVar95);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar97 = vfmadd231ps_fma(auVar20,auVar281,auVar100);
  auVar92 = vandps_avx(auVar88,auVar261);
  auVar255._8_4_ = 0x219392ef;
  auVar255._0_8_ = 0x219392ef219392ef;
  auVar255._12_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar92,auVar255,1);
  bVar6 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._0_4_;
  bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._4_4_;
  bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._8_4_;
  bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._12_4_;
  auVar92 = vandps_avx(auVar89,auVar261);
  uVar79 = vcmpps_avx512vl(auVar92,auVar255,1);
  bVar6 = (bool)((byte)uVar79 & 1);
  auVar88._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._0_4_;
  bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._4_4_;
  bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._8_4_;
  bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._12_4_;
  auVar92 = vandps_avx(auVar99,auVar261);
  uVar79 = vcmpps_avx512vl(auVar92,auVar255,1);
  bVar6 = (bool)((byte)uVar79 & 1);
  auVar89._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._0_4_;
  bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._4_4_;
  bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._8_4_;
  bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._12_4_;
  auVar90 = vrcp14ps_avx512vl(auVar91);
  auVar256._8_4_ = 0x3f800000;
  auVar256._0_8_ = 0x3f8000003f800000;
  auVar256._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar91,auVar90,auVar256);
  auVar95 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar92 = vfnmadd213ps_fma(auVar88,auVar90,auVar256);
  auVar20 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vfnmadd213ps_fma(auVar89,auVar90,auVar256);
  auVar100 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar94);
  auVar251._0_4_ = auVar95._0_4_ * auVar92._0_4_;
  auVar251._4_4_ = auVar95._4_4_ * auVar92._4_4_;
  auVar251._8_4_ = auVar95._8_4_ * auVar92._8_4_;
  auVar251._12_4_ = auVar95._12_4_ * auVar92._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar92 = vpmovsxwd_avx(auVar90);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar94);
  auVar91 = vpbroadcastd_avx512vl();
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar90 = vpmovsxwd_avx(auVar93);
  auVar202._0_4_ = auVar95._0_4_ * auVar92._0_4_;
  auVar202._4_4_ = auVar95._4_4_ * auVar92._4_4_;
  auVar202._8_4_ = auVar95._8_4_ * auVar92._8_4_;
  auVar202._12_4_ = auVar95._12_4_ * auVar92._12_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar81 * -2 + 6);
  auVar92 = vpmovsxwd_avx(auVar95);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar96);
  auVar257._0_4_ = auVar20._0_4_ * auVar92._0_4_;
  auVar257._4_4_ = auVar20._4_4_ * auVar92._4_4_;
  auVar257._8_4_ = auVar20._8_4_ * auVar92._8_4_;
  auVar257._12_4_ = auVar20._12_4_ * auVar92._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar90);
  auVar92 = vsubps_avx(auVar92,auVar96);
  auVar181._0_4_ = auVar20._0_4_ * auVar92._0_4_;
  auVar181._4_4_ = auVar20._4_4_ * auVar92._4_4_;
  auVar181._8_4_ = auVar20._8_4_ * auVar92._8_4_;
  auVar181._12_4_ = auVar20._12_4_ * auVar92._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar85 + uVar81 + 6);
  auVar92 = vpmovsxwd_avx(auVar20);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar97);
  auVar243._0_4_ = auVar100._0_4_ * auVar92._0_4_;
  auVar243._4_4_ = auVar100._4_4_ * auVar92._4_4_;
  auVar243._8_4_ = auVar100._8_4_ * auVar92._8_4_;
  auVar243._12_4_ = auVar100._12_4_ * auVar92._12_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar92 = vpmovsxwd_avx(auVar94);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar97);
  auVar161._0_4_ = auVar100._0_4_ * auVar92._0_4_;
  auVar161._4_4_ = auVar100._4_4_ * auVar92._4_4_;
  auVar161._8_4_ = auVar100._8_4_ * auVar92._8_4_;
  auVar161._12_4_ = auVar100._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar251,auVar202);
  auVar90 = vpminsd_avx(auVar257,auVar181);
  auVar92 = vmaxps_avx(auVar92,auVar90);
  auVar90 = vpminsd_avx(auVar243,auVar161);
  uVar179 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar100._4_4_ = uVar179;
  auVar100._0_4_ = uVar179;
  auVar100._8_4_ = uVar179;
  auVar100._12_4_ = uVar179;
  auVar90 = vmaxps_avx512vl(auVar90,auVar100);
  auVar92 = vmaxps_avx(auVar92,auVar90);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  local_720 = vmulps_avx512vl(auVar92,auVar96);
  auVar92 = vpmaxsd_avx(auVar251,auVar202);
  auVar90 = vpmaxsd_avx(auVar257,auVar181);
  auVar92 = vminps_avx(auVar92,auVar90);
  auVar90 = vpmaxsd_avx(auVar243,auVar161);
  uVar179 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar97._4_4_ = uVar179;
  auVar97._0_4_ = uVar179;
  auVar97._8_4_ = uVar179;
  auVar97._12_4_ = uVar179;
  auVar90 = vminps_avx512vl(auVar90,auVar97);
  auVar92 = vminps_avx(auVar92,auVar90);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar98);
  uVar21 = vcmpps_avx512vl(local_720,auVar92,2);
  local_908 = vpcmpgtd_avx512vl(auVar91,_DAT_01f7fcf0);
  local_908 = ((byte)uVar21 & 0xf) & local_908;
  if ((char)local_908 == '\0') {
    return;
  }
  local_a68 = (undefined1 (*) [32])local_240;
  auVar177 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar177);
  local_910 = prim;
LAB_01ac7131:
  lVar83 = 0;
  for (uVar79 = local_908; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  uVar82 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar83 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar82].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar83 = *(long *)&pGVar3[1].time_range.upper;
  auVar92 = *(undefined1 (*) [16])(lVar83 + (long)p_Var4 * uVar79);
  auVar90 = *(undefined1 (*) [16])(lVar83 + (uVar79 + 1) * (long)p_Var4);
  local_908 = local_908 - 1 & local_908;
  if (local_908 != 0) {
    uVar81 = local_908 - 1 & local_908;
    for (uVar85 = local_908; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    }
    if (uVar81 != 0) {
      for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar95 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar179 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar276._4_4_ = uVar179;
  auVar276._0_4_ = uVar179;
  auVar276._8_4_ = uVar179;
  auVar276._12_4_ = uVar179;
  fStack_810 = (float)uVar179;
  _local_820 = auVar276;
  fStack_80c = (float)uVar179;
  fStack_808 = (float)uVar179;
  register0x0000151c = uVar179;
  uVar179 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar282._4_4_ = uVar179;
  auVar282._0_4_ = uVar179;
  auVar282._8_4_ = uVar179;
  auVar282._12_4_ = uVar179;
  local_840._16_4_ = uVar179;
  local_840._0_16_ = auVar282;
  local_840._20_4_ = uVar179;
  local_840._24_4_ = uVar179;
  local_840._28_4_ = uVar179;
  auVar93 = vunpcklps_avx(auVar276,auVar282);
  fVar218 = *(float *)(ray + k * 4 + 0x180);
  auVar283._4_4_ = fVar218;
  auVar283._0_4_ = fVar218;
  auVar283._8_4_ = fVar218;
  auVar283._12_4_ = fVar218;
  local_860._16_4_ = fVar218;
  local_860._0_16_ = auVar283;
  local_860._20_4_ = fVar218;
  local_860._24_4_ = fVar218;
  local_860._28_4_ = fVar218;
  local_a10 = vinsertps_avx(auVar93,auVar283,0x28);
  auVar252._0_4_ = auVar92._0_4_ + auVar90._0_4_;
  auVar252._4_4_ = auVar92._4_4_ + auVar90._4_4_;
  auVar252._8_4_ = auVar92._8_4_ + auVar90._8_4_;
  auVar252._12_4_ = auVar92._12_4_ + auVar90._12_4_;
  auVar25._8_4_ = 0x3f000000;
  auVar25._0_8_ = 0x3f0000003f000000;
  auVar25._12_4_ = 0x3f000000;
  auVar93 = vmulps_avx512vl(auVar252,auVar25);
  auVar93 = vsubps_avx(auVar93,auVar95);
  auVar93 = vdpps_avx(auVar93,local_a10,0x7f);
  fVar178 = *(float *)(ray + k * 4 + 0xc0);
  auVar273 = ZEXT464((uint)fVar178);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar275 = ZEXT1664(local_a20);
  auVar258._4_12_ = ZEXT812(0) << 0x20;
  auVar258._0_4_ = local_a20._0_4_;
  auVar94 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar258);
  auVar20 = vfnmadd213ss_fma(auVar94,local_a20,ZEXT416(0x40000000));
  local_660 = auVar93._0_4_ * auVar94._0_4_ * auVar20._0_4_;
  auVar259._4_4_ = local_660;
  auVar259._0_4_ = local_660;
  auVar259._8_4_ = local_660;
  auVar259._12_4_ = local_660;
  fStack_9f0 = local_660;
  _local_a00 = auVar259;
  fStack_9ec = local_660;
  fStack_9e8 = local_660;
  fStack_9e4 = local_660;
  auVar93 = vfmadd231ps_fma(auVar95,local_a10,auVar259);
  auVar93 = vblendps_avx(auVar93,ZEXT816(0) << 0x40,8);
  auVar92 = vsubps_avx(auVar92,auVar93);
  auVar95 = vsubps_avx(*(undefined1 (*) [16])(lVar83 + (uVar79 + 2) * (long)p_Var4),auVar93);
  auVar265 = ZEXT1664(auVar95);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar269 = ZEXT1664(auVar90);
  auVar93 = vsubps_avx(*(undefined1 (*) [16])(lVar83 + (uVar79 + 3) * (long)p_Var4),auVar93);
  auVar101 = vbroadcastss_avx512vl(auVar92);
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_980 = ZEXT1632(auVar92);
  auVar102 = vpermps_avx512vl(auVar107,local_980);
  auVar108._8_4_ = 2;
  auVar108._0_8_ = 0x200000002;
  auVar108._12_4_ = 2;
  auVar108._16_4_ = 2;
  auVar108._20_4_ = 2;
  auVar108._24_4_ = 2;
  auVar108._28_4_ = 2;
  local_ae0 = vpermps_avx512vl(auVar108,local_980);
  auVar285 = ZEXT3264(local_ae0);
  auVar109._8_4_ = 3;
  auVar109._0_8_ = 0x300000003;
  auVar109._12_4_ = 3;
  auVar109._16_4_ = 3;
  auVar109._20_4_ = 3;
  auVar109._24_4_ = 3;
  auVar109._28_4_ = 3;
  auVar103 = vpermps_avx512vl(auVar109,local_980);
  local_b00 = vbroadcastss_avx512vl(auVar90);
  auVar286 = ZEXT3264(local_b00);
  local_9c0 = ZEXT1632(auVar90);
  auVar104 = vpermps_avx512vl(auVar107,local_9c0);
  auVar105 = vpermps_avx512vl(auVar108,local_9c0);
  local_b20 = vpermps_avx512vl(auVar109,local_9c0);
  auVar287 = ZEXT3264(local_b20);
  local_b40 = vbroadcastss_avx512vl(auVar95);
  auVar288 = ZEXT3264(local_b40);
  local_9a0 = ZEXT1632(auVar95);
  local_b60 = vpermps_avx512vl(auVar107,local_9a0);
  auVar289 = ZEXT3264(local_b60);
  local_5c0 = vpermps_avx512vl(auVar108,local_9a0);
  local_5e0 = vpermps_avx512vl(auVar109,local_9a0);
  local_5a0 = vbroadcastss_avx512vl(auVar93);
  _local_9e0 = ZEXT1632(auVar93);
  local_620 = vpermps_avx2(auVar107,_local_9e0);
  local_560 = vpermps_avx2(auVar108,_local_9e0);
  local_640 = vpermps_avx2(auVar109,_local_9e0);
  auVar92 = vfmadd231ps_fma(ZEXT432((uint)(fVar218 * fVar218)),local_840,local_840);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),_local_820,_local_820);
  local_580._0_4_ = auVar92._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar106);
  local_950 = ZEXT416((uint)local_660);
  local_660 = fVar178 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar177 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar177);
  iVar80 = 1;
  uVar79 = 0;
  auVar177 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar177);
  auVar92 = vsqrtss_avx(local_a20,local_a20);
  auVar90 = vsqrtss_avx(local_a20,local_a20);
  local_710 = ZEXT816(0x3f80000000000000);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar177 = ZEXT3264(auVar106);
  local_600 = local_5a0;
  do {
    auVar93 = vmovshdup_avx(local_710);
    auVar93 = vsubps_avx(auVar93,local_710);
    auVar168._0_4_ = auVar93._0_4_;
    fVar159 = auVar168._0_4_ * 0.04761905;
    uVar179 = local_710._0_4_;
    auVar246._4_4_ = uVar179;
    auVar246._0_4_ = uVar179;
    auVar246._8_4_ = uVar179;
    auVar246._12_4_ = uVar179;
    auVar246._16_4_ = uVar179;
    auVar246._20_4_ = uVar179;
    auVar246._24_4_ = uVar179;
    auVar246._28_4_ = uVar179;
    auVar168._4_4_ = auVar168._0_4_;
    auVar168._8_4_ = auVar168._0_4_;
    auVar168._12_4_ = auVar168._0_4_;
    auVar168._16_4_ = auVar168._0_4_;
    auVar168._20_4_ = auVar168._0_4_;
    auVar168._24_4_ = auVar168._0_4_;
    auVar168._28_4_ = auVar168._0_4_;
    auVar93 = vfmadd231ps_fma(auVar246,auVar168,_DAT_01faff20);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar106 = vsubps_avx512vl(auVar106,ZEXT1632(auVar93));
    auVar107 = vxorps_avx512vl(ZEXT1632(auVar93),auVar177._0_32_);
    fVar239 = auVar106._0_4_;
    fVar240 = auVar106._4_4_;
    fVar241 = auVar106._8_4_;
    fVar247 = auVar106._12_4_;
    fVar248 = auVar106._16_4_;
    fVar249 = auVar106._20_4_;
    fVar250 = auVar106._24_4_;
    auVar111._4_4_ = fVar240 * fVar240 * auVar107._4_4_;
    auVar111._0_4_ = fVar239 * fVar239 * auVar107._0_4_;
    auVar111._8_4_ = fVar241 * fVar241 * auVar107._8_4_;
    auVar111._12_4_ = fVar247 * fVar247 * auVar107._12_4_;
    auVar111._16_4_ = fVar248 * fVar248 * auVar107._16_4_;
    auVar111._20_4_ = fVar249 * fVar249 * auVar107._20_4_;
    auVar111._24_4_ = fVar250 * fVar250 * auVar107._24_4_;
    auVar111._28_4_ = auVar107._28_4_;
    fVar235 = auVar93._0_4_;
    fVar236 = auVar93._4_4_;
    fVar237 = auVar93._8_4_;
    fVar238 = auVar93._12_4_;
    auVar265._0_28_ =
         ZEXT1628(CONCAT412(fVar238 * fVar238,
                            CONCAT48(fVar237 * fVar237,CONCAT44(fVar236 * fVar236,fVar235 * fVar235)
                                    )));
    fVar266 = fVar235 * 3.0;
    fVar270 = fVar236 * 3.0;
    fVar271 = fVar237 * 3.0;
    fVar272 = fVar238 * 3.0;
    auVar151._28_36_ = auVar269._28_36_;
    auVar151._0_28_ = ZEXT1628(CONCAT412(fVar272,CONCAT48(fVar271,CONCAT44(fVar270,fVar266))));
    auVar128._0_4_ = (fVar266 + -5.0) * fVar235 * fVar235;
    auVar128._4_4_ = (fVar270 + -5.0) * fVar236 * fVar236;
    auVar128._8_4_ = (fVar271 + -5.0) * fVar237 * fVar237;
    auVar128._12_4_ = (fVar272 + -5.0) * fVar238 * fVar238;
    auVar128._16_4_ = 0x80000000;
    auVar128._20_4_ = 0x80000000;
    auVar128._24_4_ = 0x80000000;
    auVar128._28_4_ = 0;
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar108 = vaddps_avx512vl(auVar128,auVar107);
    auVar274._0_4_ = fVar239 * fVar239;
    auVar274._4_4_ = fVar240 * fVar240;
    auVar274._8_4_ = fVar241 * fVar241;
    auVar274._12_4_ = fVar247 * fVar247;
    auVar274._16_4_ = fVar248 * fVar248;
    auVar274._20_4_ = fVar249 * fVar249;
    auVar274._28_36_ = auVar273._28_36_;
    auVar274._24_4_ = fVar250 * fVar250;
    auVar115._4_4_ = auVar274._4_4_ * (fVar240 * 3.0 + -5.0);
    auVar115._0_4_ = auVar274._0_4_ * (fVar239 * 3.0 + -5.0);
    auVar115._8_4_ = auVar274._8_4_ * (fVar241 * 3.0 + -5.0);
    auVar115._12_4_ = auVar274._12_4_ * (fVar247 * 3.0 + -5.0);
    auVar115._16_4_ = auVar274._16_4_ * (fVar248 * 3.0 + -5.0);
    auVar115._20_4_ = auVar274._20_4_ * (fVar249 * 3.0 + -5.0);
    auVar115._24_4_ = auVar274._24_4_ * (fVar250 * 3.0 + -5.0);
    auVar115._28_4_ = auVar275._28_4_ + -5.0;
    auVar109 = vaddps_avx512vl(auVar115,auVar107);
    auVar110 = vxorps_avx512vl(auVar106,auVar177._0_32_);
    auVar116._4_4_ = fVar236 * fVar236 * auVar110._4_4_;
    auVar116._0_4_ = fVar235 * fVar235 * auVar110._0_4_;
    auVar116._8_4_ = fVar237 * fVar237 * auVar110._8_4_;
    auVar116._12_4_ = fVar238 * fVar238 * auVar110._12_4_;
    auVar116._16_4_ = auVar110._16_4_ * 0.0 * 0.0;
    auVar116._20_4_ = auVar110._20_4_ * 0.0 * 0.0;
    auVar116._24_4_ = auVar110._24_4_ * 0.0 * 0.0;
    auVar116._28_4_ = auVar110._28_4_;
    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar111 = vmulps_avx512vl(auVar111,auVar110);
    auVar112 = vmulps_avx512vl(auVar108,auVar110);
    auVar109 = vmulps_avx512vl(auVar109,auVar110);
    auVar113 = vmulps_avx512vl(auVar116,auVar110);
    auVar114 = vmulps_avx512vl(local_600,auVar113);
    auVar117._4_4_ = local_620._4_4_ * auVar113._4_4_;
    auVar117._0_4_ = local_620._0_4_ * auVar113._0_4_;
    auVar117._8_4_ = local_620._8_4_ * auVar113._8_4_;
    auVar117._12_4_ = local_620._12_4_ * auVar113._12_4_;
    auVar117._16_4_ = local_620._16_4_ * auVar113._16_4_;
    auVar117._20_4_ = local_620._20_4_ * auVar113._20_4_;
    auVar117._24_4_ = local_620._24_4_ * auVar113._24_4_;
    auVar117._28_4_ = auVar108._28_4_;
    auVar108 = vmulps_avx512vl(local_560,auVar113);
    auVar118._4_4_ = local_640._4_4_ * auVar113._4_4_;
    auVar118._0_4_ = local_640._0_4_ * auVar113._0_4_;
    auVar118._8_4_ = local_640._8_4_ * auVar113._8_4_;
    auVar118._12_4_ = local_640._12_4_ * auVar113._12_4_;
    auVar118._16_4_ = local_640._16_4_ * auVar113._16_4_;
    auVar118._20_4_ = local_640._20_4_ * auVar113._20_4_;
    auVar118._24_4_ = local_640._24_4_ * auVar113._24_4_;
    auVar118._28_4_ = auVar113._28_4_;
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar109,auVar288._0_32_);
    auVar114 = vfmadd231ps_avx512vl(auVar117,auVar109,auVar289._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar109,local_5c0);
    auVar109 = vfmadd231ps_avx512vl(auVar118,local_5e0,auVar109);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar286._0_32_);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar104);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar105);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar287._0_32_,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar101);
    auVar116 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar102);
    auVar117 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar285._0_32_);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar111);
    fVar218 = auVar106._28_4_;
    auVar119._4_4_ = (fVar240 + fVar240) * fVar236;
    auVar119._0_4_ = (fVar239 + fVar239) * fVar235;
    auVar119._8_4_ = (fVar241 + fVar241) * fVar237;
    auVar119._12_4_ = (fVar247 + fVar247) * fVar238;
    auVar119._16_4_ = (fVar248 + fVar248) * 0.0;
    auVar119._20_4_ = (fVar249 + fVar249) * 0.0;
    auVar119._24_4_ = (fVar250 + fVar250) * 0.0;
    auVar119._28_4_ = auVar112._28_4_;
    auVar106 = vsubps_avx(auVar119,auVar274._0_32_);
    auVar129._0_28_ =
         ZEXT1628(CONCAT412((fVar238 + fVar238) * (fVar272 + -5.0) + fVar272 * fVar238,
                            CONCAT48((fVar237 + fVar237) * (fVar271 + -5.0) + fVar271 * fVar237,
                                     CONCAT44((fVar236 + fVar236) * (fVar270 + -5.0) +
                                              fVar270 * fVar236,
                                              (fVar235 + fVar235) * (fVar266 + -5.0) +
                                              fVar266 * fVar235))));
    auVar129._28_4_ = auVar269._28_4_ + -5.0 + 0.0;
    auVar107 = vaddps_avx512vl(auVar151._0_32_,auVar107);
    auVar120._4_4_ = (fVar240 + fVar240) * auVar107._4_4_;
    auVar120._0_4_ = (fVar239 + fVar239) * auVar107._0_4_;
    auVar120._8_4_ = (fVar241 + fVar241) * auVar107._8_4_;
    auVar120._12_4_ = (fVar247 + fVar247) * auVar107._12_4_;
    auVar120._16_4_ = (fVar248 + fVar248) * auVar107._16_4_;
    auVar120._20_4_ = (fVar249 + fVar249) * auVar107._20_4_;
    auVar120._24_4_ = (fVar250 + fVar250) * auVar107._24_4_;
    auVar120._28_4_ = auVar107._28_4_;
    auVar121._4_4_ = fVar240 * 3.0 * fVar240;
    auVar121._0_4_ = fVar239 * 3.0 * fVar239;
    auVar121._8_4_ = fVar241 * 3.0 * fVar241;
    auVar121._12_4_ = fVar247 * 3.0 * fVar247;
    auVar121._16_4_ = fVar248 * 3.0 * fVar248;
    auVar121._20_4_ = fVar249 * 3.0 * fVar249;
    auVar121._24_4_ = fVar250 * 3.0 * fVar250;
    auVar121._28_4_ = fVar218;
    auVar107 = vsubps_avx(auVar120,auVar121);
    auVar108 = vsubps_avx(auVar265._0_32_,auVar119);
    auVar111 = vmulps_avx512vl(auVar106,auVar110);
    auVar113 = vmulps_avx512vl(auVar129,auVar110);
    auVar107 = vmulps_avx512vl(auVar107,auVar110);
    auVar108 = vmulps_avx512vl(auVar108,auVar110);
    auVar110 = vmulps_avx512vl(local_600,auVar108);
    auVar122._4_4_ = local_620._4_4_ * auVar108._4_4_;
    auVar122._0_4_ = local_620._0_4_ * auVar108._0_4_;
    auVar122._8_4_ = local_620._8_4_ * auVar108._8_4_;
    auVar122._12_4_ = local_620._12_4_ * auVar108._12_4_;
    auVar122._16_4_ = local_620._16_4_ * auVar108._16_4_;
    auVar122._20_4_ = local_620._20_4_ * auVar108._20_4_;
    auVar122._24_4_ = local_620._24_4_ * auVar108._24_4_;
    auVar122._28_4_ = auVar106._28_4_;
    auVar106 = vmulps_avx512vl(local_560,auVar108);
    auVar123._4_4_ = local_640._4_4_ * auVar108._4_4_;
    auVar123._0_4_ = local_640._0_4_ * auVar108._0_4_;
    auVar123._8_4_ = local_640._8_4_ * auVar108._8_4_;
    auVar123._12_4_ = local_640._12_4_ * auVar108._12_4_;
    auVar123._16_4_ = local_640._16_4_ * auVar108._16_4_;
    auVar123._20_4_ = local_640._20_4_ * auVar108._20_4_;
    auVar123._24_4_ = local_640._24_4_ * auVar108._24_4_;
    auVar123._28_4_ = auVar108._28_4_;
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar288._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar122,auVar107,auVar289._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar107,local_5c0);
    auVar107 = vfmadd231ps_avx512vl(auVar123,local_5e0,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,auVar286._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar287._0_32_,auVar113);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar101);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar111,auVar102);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,auVar285._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar111);
    auVar136._4_4_ = auVar108._4_4_ * fVar159;
    auVar136._0_4_ = auVar108._0_4_ * fVar159;
    auVar136._8_4_ = auVar108._8_4_ * fVar159;
    auVar136._12_4_ = auVar108._12_4_ * fVar159;
    auVar136._16_4_ = auVar108._16_4_ * fVar159;
    auVar136._20_4_ = auVar108._20_4_ * fVar159;
    auVar136._24_4_ = auVar108._24_4_ * fVar159;
    auVar136._28_4_ = fVar218 + fVar218;
    auVar137._4_4_ = auVar110._4_4_ * fVar159;
    auVar137._0_4_ = auVar110._0_4_ * fVar159;
    auVar137._8_4_ = auVar110._8_4_ * fVar159;
    auVar137._12_4_ = auVar110._12_4_ * fVar159;
    auVar137._16_4_ = auVar110._16_4_ * fVar159;
    auVar137._20_4_ = auVar110._20_4_ * fVar159;
    auVar137._24_4_ = auVar110._24_4_ * fVar159;
    auVar137._28_4_ = auVar112._28_4_;
    auVar138._4_4_ = auVar106._4_4_ * fVar159;
    auVar138._0_4_ = auVar106._0_4_ * fVar159;
    auVar138._8_4_ = auVar106._8_4_ * fVar159;
    auVar138._12_4_ = auVar106._12_4_ * fVar159;
    auVar138._16_4_ = auVar106._16_4_ * fVar159;
    auVar138._20_4_ = auVar106._20_4_ * fVar159;
    auVar138._24_4_ = auVar106._24_4_ * fVar159;
    auVar138._28_4_ = 0;
    fVar218 = fVar159 * auVar107._0_4_;
    fVar235 = fVar159 * auVar107._4_4_;
    auVar126._4_4_ = fVar235;
    auVar126._0_4_ = fVar218;
    fVar236 = fVar159 * auVar107._8_4_;
    auVar126._8_4_ = fVar236;
    fVar237 = fVar159 * auVar107._12_4_;
    auVar126._12_4_ = fVar237;
    fVar238 = fVar159 * auVar107._16_4_;
    auVar126._16_4_ = fVar238;
    fVar239 = fVar159 * auVar107._20_4_;
    auVar126._20_4_ = fVar239;
    fVar240 = fVar159 * auVar107._24_4_;
    auVar126._24_4_ = fVar240;
    auVar126._28_4_ = fVar159;
    auVar93 = vxorps_avx512vl(auVar287._0_16_,auVar287._0_16_);
    auVar118 = vpermt2ps_avx512vl(auVar115,_DAT_01feed00,ZEXT1632(auVar93));
    auVar119 = vpermt2ps_avx512vl(auVar116,_DAT_01feed00,ZEXT1632(auVar93));
    auVar273 = ZEXT3264(auVar119);
    auVar108 = ZEXT1632(auVar93);
    auVar120 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,auVar108);
    auVar275 = ZEXT3264(auVar120);
    auVar130._0_4_ = auVar109._0_4_ + fVar218;
    auVar130._4_4_ = auVar109._4_4_ + fVar235;
    auVar130._8_4_ = auVar109._8_4_ + fVar236;
    auVar130._12_4_ = auVar109._12_4_ + fVar237;
    auVar130._16_4_ = auVar109._16_4_ + fVar238;
    auVar130._20_4_ = auVar109._20_4_ + fVar239;
    auVar130._24_4_ = auVar109._24_4_ + fVar240;
    auVar130._28_4_ = auVar109._28_4_ + fVar159;
    auVar106 = vmaxps_avx(auVar109,auVar130);
    auVar107 = vminps_avx(auVar109,auVar130);
    auVar112 = vpermt2ps_avx512vl(auVar109,_DAT_01feed00,auVar108);
    auVar121 = vpermt2ps_avx512vl(auVar136,_DAT_01feed00,auVar108);
    auVar269 = ZEXT3264(auVar121);
    auVar122 = vpermt2ps_avx512vl(auVar137,_DAT_01feed00,auVar108);
    auVar132 = ZEXT1632(auVar93);
    auVar123 = vpermt2ps_avx512vl(auVar138,_DAT_01feed00,auVar132);
    auVar108 = vpermt2ps_avx512vl(auVar126,_DAT_01feed00,auVar132);
    auVar113 = vsubps_avx512vl(auVar112,auVar108);
    auVar108 = vsubps_avx(auVar118,auVar115);
    auVar265 = ZEXT3264(auVar108);
    auVar109 = vsubps_avx(auVar119,auVar116);
    auVar111 = vsubps_avx(auVar120,auVar117);
    auVar110 = vmulps_avx512vl(auVar109,auVar138);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar137,auVar111);
    auVar114 = vmulps_avx512vl(auVar111,auVar136);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar138,auVar108);
    auVar124 = vmulps_avx512vl(auVar108,auVar137);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar136,auVar109);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar114 = vfmadd231ps_avx512vl(auVar124,auVar114,auVar114);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar110 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar124 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar108);
    auVar125 = vrcp14ps_avx512vl(auVar124);
    auVar110._8_4_ = 0x3f800000;
    auVar110._0_8_ = 0x3f8000003f800000;
    auVar110._12_4_ = 0x3f800000;
    auVar110._16_4_ = 0x3f800000;
    auVar110._20_4_ = 0x3f800000;
    auVar110._24_4_ = 0x3f800000;
    auVar110._28_4_ = 0x3f800000;
    auVar110 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar110);
    auVar110 = vfmadd132ps_avx512vl(auVar110,auVar125,auVar125);
    auVar114 = vmulps_avx512vl(auVar114,auVar110);
    auVar125 = vmulps_avx512vl(auVar109,auVar123);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar122,auVar111);
    auVar126 = vmulps_avx512vl(auVar111,auVar121);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar123,auVar108);
    auVar127 = vmulps_avx512vl(auVar108,auVar122);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar121,auVar109);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar110 = vmulps_avx512vl(auVar125,auVar110);
    auVar110 = vmaxps_avx512vl(auVar114,auVar110);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar114 = vmaxps_avx512vl(auVar113,auVar112);
    auVar106 = vmaxps_avx512vl(auVar106,auVar114);
    auVar125 = vaddps_avx512vl(auVar110,auVar106);
    auVar106 = vminps_avx512vl(auVar113,auVar112);
    auVar106 = vminps_avx(auVar107,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar110);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar107 = vmulps_avx512vl(auVar125,auVar112);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    auVar106 = vmulps_avx512vl(auVar106,auVar113);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar110 = vrsqrt14ps_avx512vl(auVar124);
    auVar114._8_4_ = 0xbf000000;
    auVar114._0_8_ = 0xbf000000bf000000;
    auVar114._12_4_ = 0xbf000000;
    auVar114._16_4_ = 0xbf000000;
    auVar114._20_4_ = 0xbf000000;
    auVar114._24_4_ = 0xbf000000;
    auVar114._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar124,auVar114);
    fVar218 = auVar110._0_4_;
    fVar235 = auVar110._4_4_;
    fVar236 = auVar110._8_4_;
    fVar237 = auVar110._12_4_;
    fVar238 = auVar110._16_4_;
    fVar159 = auVar110._20_4_;
    fVar239 = auVar110._24_4_;
    auVar127._4_4_ = fVar235 * fVar235 * fVar235 * auVar112._4_4_;
    auVar127._0_4_ = fVar218 * fVar218 * fVar218 * auVar112._0_4_;
    auVar127._8_4_ = fVar236 * fVar236 * fVar236 * auVar112._8_4_;
    auVar127._12_4_ = fVar237 * fVar237 * fVar237 * auVar112._12_4_;
    auVar127._16_4_ = fVar238 * fVar238 * fVar238 * auVar112._16_4_;
    auVar127._20_4_ = fVar159 * fVar159 * fVar159 * auVar112._20_4_;
    auVar127._24_4_ = fVar239 * fVar239 * fVar239 * auVar112._24_4_;
    auVar127._28_4_ = auVar125._28_4_;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar110 = vfmadd231ps_avx512vl(auVar127,auVar110,auVar124);
    auVar112 = vmulps_avx512vl(auVar108,auVar110);
    auVar113 = vmulps_avx512vl(auVar109,auVar110);
    auVar114 = vmulps_avx512vl(auVar111,auVar110);
    auVar124 = vsubps_avx512vl(auVar132,auVar115);
    auVar126 = vsubps_avx512vl(auVar132,auVar116);
    auVar127 = vsubps_avx512vl(auVar132,auVar117);
    auVar125 = vmulps_avx512vl(local_860,auVar127);
    auVar125 = vfmadd231ps_avx512vl(auVar125,local_840,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar125,_local_820,auVar124);
    auVar128 = vmulps_avx512vl(auVar127,auVar127);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar126,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar124,auVar124);
    auVar129 = vmulps_avx512vl(local_860,auVar114);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar113,local_840);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar112,_local_820);
    auVar114 = vmulps_avx512vl(auVar127,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar126,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar124,auVar112);
    auVar113 = vmulps_avx512vl(auVar129,auVar129);
    auVar114 = vsubps_avx512vl(local_580,auVar113);
    auVar130 = vmulps_avx512vl(auVar129,auVar112);
    auVar125 = vsubps_avx512vl(auVar125,auVar130);
    auVar130 = vaddps_avx512vl(auVar125,auVar125);
    auVar125 = vmulps_avx512vl(auVar112,auVar112);
    auVar128 = vsubps_avx512vl(auVar128,auVar125);
    auVar107 = vsubps_avx512vl(auVar128,auVar107);
    local_aa0 = vmulps_avx512vl(auVar130,auVar130);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar114,auVar125);
    auVar125 = vmulps_avx512vl(_local_880,auVar107);
    auVar125 = vsubps_avx512vl(local_aa0,auVar125);
    uVar85 = vcmpps_avx512vl(auVar125,auVar132,5);
    bVar74 = (byte)uVar85;
    fVar218 = (float)local_a00._0_4_;
    fVar235 = (float)local_a00._4_4_;
    fVar236 = fStack_9f8;
    fVar237 = fStack_9f4;
    fVar238 = fStack_9f0;
    fVar159 = fStack_9ec;
    fVar239 = fStack_9e8;
    fVar240 = fStack_9e4;
    if (bVar74 == 0) {
LAB_01ac7e62:
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar177 = ZEXT3264(auVar106);
      auVar285 = ZEXT3264(local_ae0);
      auVar286 = ZEXT3264(local_b00);
      auVar287 = ZEXT3264(local_b20);
      auVar288 = ZEXT3264(local_b40);
      auVar289 = ZEXT3264(local_b60);
    }
    else {
      local_800._0_32_ = auVar128;
      auVar125 = vsqrtps_avx512vl(auVar125);
      auVar131 = vaddps_avx512vl(auVar114,auVar114);
      local_a60 = vrcp14ps_avx512vl(auVar131);
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = 0x3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar132._16_4_ = 0x3f800000;
      auVar132._20_4_ = 0x3f800000;
      auVar132._24_4_ = 0x3f800000;
      auVar132._28_4_ = 0x3f800000;
      auVar132 = vfnmadd213ps_avx512vl(local_a60,auVar131,auVar132);
      auVar132 = vfmadd132ps_avx512vl(auVar132,local_a60,local_a60);
      auVar133._8_4_ = 0x80000000;
      auVar133._0_8_ = 0x8000000080000000;
      auVar133._12_4_ = 0x80000000;
      auVar133._16_4_ = 0x80000000;
      auVar133._20_4_ = 0x80000000;
      auVar133._24_4_ = 0x80000000;
      auVar133._28_4_ = 0x80000000;
      local_8a0 = vxorps_avx512vl(auVar130,auVar133);
      auVar133 = vsubps_avx512vl(local_8a0,auVar125);
      local_ac0 = vmulps_avx512vl(auVar133,auVar132);
      auVar125 = vsubps_avx512vl(auVar125,auVar130);
      local_8c0 = vmulps_avx512vl(auVar125,auVar132);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132 = vblendmps_avx512vl(auVar125,local_ac0);
      auVar134._0_4_ =
           (uint)(bVar74 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar125._0_4_;
      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar6 * auVar132._4_4_ | (uint)!bVar6 * auVar125._4_4_;
      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar6 * auVar132._8_4_ | (uint)!bVar6 * auVar125._8_4_;
      bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar125._12_4_;
      bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar6 * auVar132._16_4_ | (uint)!bVar6 * auVar125._16_4_;
      bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar6 * auVar132._20_4_ | (uint)!bVar6 * auVar125._20_4_;
      bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar6 * auVar132._24_4_ | (uint)!bVar6 * auVar125._24_4_;
      bVar6 = SUB81(uVar85 >> 7,0);
      auVar134._28_4_ = (uint)bVar6 * auVar132._28_4_ | (uint)!bVar6 * auVar125._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar132 = vblendmps_avx512vl(auVar125,local_8c0);
      auVar135._0_4_ =
           (uint)(bVar74 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar125._0_4_;
      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar6 * auVar132._4_4_ | (uint)!bVar6 * auVar125._4_4_;
      bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar6 * auVar132._8_4_ | (uint)!bVar6 * auVar125._8_4_;
      bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar125._12_4_;
      bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar135._16_4_ = (uint)bVar6 * auVar132._16_4_ | (uint)!bVar6 * auVar125._16_4_;
      bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar135._20_4_ = (uint)bVar6 * auVar132._20_4_ | (uint)!bVar6 * auVar125._20_4_;
      bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar135._24_4_ = (uint)bVar6 * auVar132._24_4_ | (uint)!bVar6 * auVar125._24_4_;
      bVar6 = SUB81(uVar85 >> 7,0);
      auVar135._28_4_ = (uint)bVar6 * auVar132._28_4_ | (uint)!bVar6 * auVar125._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar113,auVar125);
      local_8e0 = vmaxps_avx512vl(local_5a0,auVar125);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      local_a40 = vmulps_avx512vl(local_8e0,auVar35);
      vandps_avx512vl(auVar114,auVar125);
      uVar81 = vcmpps_avx512vl(local_a40,local_a40,1);
      uVar85 = uVar85 & uVar81;
      bVar77 = (byte)uVar85;
      if (bVar77 != 0) {
        uVar81 = vcmpps_avx512vl(auVar107,_DAT_01faff00,2);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = vblendmps_avx512vl(auVar107,auVar113);
        bVar78 = (byte)uVar81;
        uVar87 = (uint)(bVar78 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar78 & 1) * local_a40._0_4_;
        bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
        uVar86 = (uint)bVar6 * auVar114._4_4_ | (uint)!bVar6 * local_a40._4_4_;
        bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
        uVar152 = (uint)bVar6 * auVar114._8_4_ | (uint)!bVar6 * local_a40._8_4_;
        bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
        uVar153 = (uint)bVar6 * auVar114._12_4_ | (uint)!bVar6 * local_a40._12_4_;
        bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
        uVar154 = (uint)bVar6 * auVar114._16_4_ | (uint)!bVar6 * local_a40._16_4_;
        bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
        uVar155 = (uint)bVar6 * auVar114._20_4_ | (uint)!bVar6 * local_a40._20_4_;
        bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
        uVar156 = (uint)bVar6 * auVar114._24_4_ | (uint)!bVar6 * local_a40._24_4_;
        bVar6 = SUB81(uVar81 >> 7,0);
        uVar157 = (uint)bVar6 * auVar114._28_4_ | (uint)!bVar6 * local_a40._28_4_;
        auVar134._0_4_ = (bVar77 & 1) * uVar87 | !(bool)(bVar77 & 1) * auVar134._0_4_;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar134._4_4_ = bVar6 * uVar86 | !bVar6 * auVar134._4_4_;
        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar134._8_4_ = bVar6 * uVar152 | !bVar6 * auVar134._8_4_;
        bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar134._12_4_ = bVar6 * uVar153 | !bVar6 * auVar134._12_4_;
        bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar134._16_4_ = bVar6 * uVar154 | !bVar6 * auVar134._16_4_;
        bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar134._20_4_ = bVar6 * uVar155 | !bVar6 * auVar134._20_4_;
        bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar134._24_4_ = bVar6 * uVar156 | !bVar6 * auVar134._24_4_;
        bVar6 = SUB81(uVar85 >> 7,0);
        auVar134._28_4_ = bVar6 * uVar157 | !bVar6 * auVar134._28_4_;
        auVar107 = vblendmps_avx512vl(auVar113,auVar107);
        bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar81 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar81 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar81 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar81 >> 6) & 1);
        bVar13 = SUB81(uVar81 >> 7,0);
        auVar135._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar78 & 1) * auVar107._0_4_ | !(bool)(bVar78 & 1) * uVar87) |
             !(bool)(bVar77 & 1) * auVar135._0_4_;
        bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar135._4_4_ =
             (uint)bVar7 * ((uint)bVar6 * auVar107._4_4_ | !bVar6 * uVar86) |
             !bVar7 * auVar135._4_4_;
        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar135._8_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar107._8_4_ | !bVar8 * uVar152) |
             !bVar6 * auVar135._8_4_;
        bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar135._12_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar107._12_4_ | !bVar9 * uVar153) |
             !bVar6 * auVar135._12_4_;
        bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar135._16_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar107._16_4_ | !bVar10 * uVar154) |
             !bVar6 * auVar135._16_4_;
        bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar135._20_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar107._20_4_ | !bVar11 * uVar155) |
             !bVar6 * auVar135._20_4_;
        bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar135._24_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar107._24_4_ | !bVar12 * uVar156) |
             !bVar6 * auVar135._24_4_;
        bVar6 = SUB81(uVar85 >> 7,0);
        auVar135._28_4_ =
             (uint)bVar6 * ((uint)bVar13 * auVar107._28_4_ | !bVar13 * uVar157) |
             !bVar6 * auVar135._28_4_;
        bVar74 = (~bVar77 | bVar78) & bVar74;
      }
      if ((bVar74 & 0x7f) == 0) goto LAB_01ac7e62;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar123,auVar107);
      auVar114 = vxorps_avx512vl(auVar121,auVar107);
      uVar87 = *(uint *)(ray + k * 4 + 0x200);
      auVar125 = vxorps_avx512vl(auVar122,auVar107);
      local_a80 = ZEXT416(uVar87);
      auVar93 = vsubss_avx512f(local_a80,ZEXT416((uint)local_950._0_4_));
      auVar121 = vbroadcastss_avx512vl(auVar93);
      auVar121 = vminps_avx512vl(auVar121,auVar135);
      auVar73._4_4_ = fStack_65c;
      auVar73._0_4_ = local_660;
      auVar73._8_4_ = fStack_658;
      auVar73._12_4_ = fStack_654;
      auVar73._16_4_ = fStack_650;
      auVar73._20_4_ = fStack_64c;
      auVar73._24_4_ = fStack_648;
      auVar73._28_4_ = fStack_644;
      auVar122 = vmaxps_avx512vl(auVar73,auVar134);
      auVar123 = vmulps_avx512vl(auVar127,auVar138);
      auVar123 = vfmadd213ps_avx512vl(auVar126,auVar137,auVar123);
      auVar93 = vfmadd213ps_fma(auVar124,auVar136,auVar123);
      auVar124 = vmulps_avx512vl(local_860,auVar138);
      auVar124 = vfmadd231ps_avx512vl(auVar124,local_840,auVar137);
      auVar95 = vfmadd231ps_fma(auVar124,_local_820,auVar136);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar95),auVar124);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar124,auVar123,1);
      auVar136 = vxorps_avx512vl(ZEXT1632(auVar93),auVar107);
      auVar137 = vrcp14ps_avx512vl(ZEXT1632(auVar95));
      auVar133 = ZEXT1632(auVar95);
      auVar138 = vxorps_avx512vl(auVar133,auVar107);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar127 = vfnmadd213ps_avx512vl(auVar137,auVar133,auVar126);
      auVar93 = vfmadd132ps_fma(auVar127,auVar137,auVar137);
      fVar241 = auVar93._0_4_ * auVar136._0_4_;
      fVar247 = auVar93._4_4_ * auVar136._4_4_;
      auVar40._4_4_ = fVar247;
      auVar40._0_4_ = fVar241;
      fVar248 = auVar93._8_4_ * auVar136._8_4_;
      auVar40._8_4_ = fVar248;
      fVar249 = auVar93._12_4_ * auVar136._12_4_;
      auVar40._12_4_ = fVar249;
      fVar250 = auVar136._16_4_ * 0.0;
      auVar40._16_4_ = fVar250;
      fVar266 = auVar136._20_4_ * 0.0;
      auVar40._20_4_ = fVar266;
      fVar270 = auVar136._24_4_ * 0.0;
      auVar40._24_4_ = fVar270;
      auVar40._28_4_ = auVar136._28_4_;
      uVar22 = vcmpps_avx512vl(auVar133,auVar138,1);
      bVar77 = (byte)uVar21 | (byte)uVar22;
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar132 = vblendmps_avx512vl(auVar40,auVar127);
      auVar139._0_4_ =
           (uint)(bVar77 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar137._0_4_;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar6 * auVar132._4_4_ | (uint)!bVar6 * auVar137._4_4_;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar6 * auVar132._8_4_ | (uint)!bVar6 * auVar137._8_4_;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar137._12_4_;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar6 * auVar132._16_4_ | (uint)!bVar6 * auVar137._16_4_;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar6 * auVar132._20_4_ | (uint)!bVar6 * auVar137._20_4_;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar6 * auVar132._24_4_ | (uint)!bVar6 * auVar137._24_4_;
      auVar139._28_4_ =
           (uint)(bVar77 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar137._28_4_;
      auVar137 = vmaxps_avx512vl(auVar122,auVar139);
      uVar22 = vcmpps_avx512vl(auVar133,auVar138,6);
      bVar77 = (byte)uVar21 | (byte)uVar22;
      auVar140._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar241;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar247;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar248;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar249;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar250;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar266;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar270;
      auVar140._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar136._28_4_;
      auVar136 = vminps_avx512vl(auVar121,auVar140);
      auVar93 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar93),auVar118);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar93),auVar119);
      auVar122 = ZEXT1632(auVar93);
      auVar120 = vsubps_avx512vl(auVar122,auVar120);
      auVar120 = vmulps_avx512vl(auVar120,auVar113);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar125,auVar119);
      auVar118 = vfmadd231ps_avx512vl(auVar119,auVar114,auVar118);
      auVar113 = vmulps_avx512vl(local_860,auVar113);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_840,auVar125);
      auVar113 = vfmadd231ps_avx512vl(auVar113,_local_820,auVar114);
      vandps_avx512vl(auVar113,auVar124);
      uVar21 = vcmpps_avx512vl(auVar113,auVar123,1);
      auVar114 = vxorps_avx512vl(auVar118,auVar107);
      auVar124 = vrcp14ps_avx512vl(auVar113);
      auVar107 = vxorps_avx512vl(auVar113,auVar107);
      auVar275 = ZEXT3264(auVar107);
      auVar125 = vfnmadd213ps_avx512vl(auVar124,auVar113,auVar126);
      auVar93 = vfmadd132ps_fma(auVar125,auVar124,auVar124);
      fVar241 = auVar93._0_4_ * auVar114._0_4_;
      fVar247 = auVar93._4_4_ * auVar114._4_4_;
      auVar41._4_4_ = fVar247;
      auVar41._0_4_ = fVar241;
      fVar248 = auVar93._8_4_ * auVar114._8_4_;
      auVar41._8_4_ = fVar248;
      fVar249 = auVar93._12_4_ * auVar114._12_4_;
      auVar41._12_4_ = fVar249;
      fVar250 = auVar114._16_4_ * 0.0;
      auVar41._16_4_ = fVar250;
      fVar266 = auVar114._20_4_ * 0.0;
      auVar41._20_4_ = fVar266;
      fVar270 = auVar114._24_4_ * 0.0;
      auVar41._24_4_ = fVar270;
      auVar41._28_4_ = auVar114._28_4_;
      uVar22 = vcmpps_avx512vl(auVar113,auVar107,1);
      bVar77 = (byte)uVar21 | (byte)uVar22;
      auVar125 = vblendmps_avx512vl(auVar41,auVar127);
      auVar141._0_4_ =
           (uint)(bVar77 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar124._0_4_;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar6 * auVar125._4_4_ | (uint)!bVar6 * auVar124._4_4_;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar6 * auVar125._8_4_ | (uint)!bVar6 * auVar124._8_4_;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar6 * auVar125._12_4_ | (uint)!bVar6 * auVar124._12_4_;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar6 * auVar125._16_4_ | (uint)!bVar6 * auVar124._16_4_;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar6 * auVar125._20_4_ | (uint)!bVar6 * auVar124._20_4_;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar6 * auVar125._24_4_ | (uint)!bVar6 * auVar124._24_4_;
      auVar141._28_4_ =
           (uint)(bVar77 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar124._28_4_;
      auVar273 = ZEXT3264(auVar141);
      _local_900 = vmaxps_avx(auVar137,auVar141);
      auVar269 = ZEXT3264(_local_900);
      uVar22 = vcmpps_avx512vl(auVar113,auVar107,6);
      bVar77 = (byte)uVar21 | (byte)uVar22;
      auVar142._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar241;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar247;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar248;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar249;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar250;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar266;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar270;
      auVar142._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar114._28_4_;
      local_6c0 = vminps_avx(auVar136,auVar142);
      uVar21 = vcmpps_avx512vl(_local_900,local_6c0,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar21;
      if (bVar74 == 0) goto LAB_01ac7e62;
      auVar107 = vmaxps_avx512vl(auVar122,auVar106);
      auVar106 = vfmadd213ps_avx512vl(local_ac0,auVar129,auVar112);
      fVar241 = auVar110._0_4_;
      fVar247 = auVar110._4_4_;
      auVar42._4_4_ = fVar247 * auVar106._4_4_;
      auVar42._0_4_ = fVar241 * auVar106._0_4_;
      fVar248 = auVar110._8_4_;
      auVar42._8_4_ = fVar248 * auVar106._8_4_;
      fVar249 = auVar110._12_4_;
      auVar42._12_4_ = fVar249 * auVar106._12_4_;
      fVar250 = auVar110._16_4_;
      auVar42._16_4_ = fVar250 * auVar106._16_4_;
      fVar266 = auVar110._20_4_;
      auVar42._20_4_ = fVar266 * auVar106._20_4_;
      fVar270 = auVar110._24_4_;
      auVar42._24_4_ = fVar270 * auVar106._24_4_;
      auVar42._28_4_ = auVar106._28_4_;
      auVar106 = vfmadd213ps_avx512vl(local_8c0,auVar129,auVar112);
      auVar43._4_4_ = fVar247 * auVar106._4_4_;
      auVar43._0_4_ = fVar241 * auVar106._0_4_;
      auVar43._8_4_ = fVar248 * auVar106._8_4_;
      auVar43._12_4_ = fVar249 * auVar106._12_4_;
      auVar43._16_4_ = fVar250 * auVar106._16_4_;
      auVar43._20_4_ = fVar266 * auVar106._20_4_;
      auVar43._24_4_ = fVar270 * auVar106._24_4_;
      auVar43._28_4_ = auVar141._28_4_;
      auVar106 = vminps_avx512vl(auVar42,auVar126);
      auVar113 = ZEXT832(0) << 0x20;
      auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      auVar114 = vminps_avx512vl(auVar43,auVar126);
      auVar44._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar106._28_4_ + 7.0;
      auVar93 = vfmadd213ps_fma(auVar44,auVar168,auVar246);
      local_4e0 = ZEXT1632(auVar93);
      auVar106 = vmaxps_avx(auVar114,ZEXT832(0) << 0x20);
      auVar45._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar106._28_4_ + 7.0;
      auVar93 = vfmadd213ps_fma(auVar45,auVar168,auVar246);
      local_500 = ZEXT1632(auVar93);
      auVar46._4_4_ = auVar107._4_4_ * auVar107._4_4_;
      auVar46._0_4_ = auVar107._0_4_ * auVar107._0_4_;
      auVar46._8_4_ = auVar107._8_4_ * auVar107._8_4_;
      auVar46._12_4_ = auVar107._12_4_ * auVar107._12_4_;
      auVar46._16_4_ = auVar107._16_4_ * auVar107._16_4_;
      auVar46._20_4_ = auVar107._20_4_ * auVar107._20_4_;
      auVar46._24_4_ = auVar107._24_4_ * auVar107._24_4_;
      auVar46._28_4_ = auVar107._28_4_;
      auVar106 = vsubps_avx(auVar128,auVar46);
      auVar47._4_4_ = auVar106._4_4_ * (float)local_880._4_4_;
      auVar47._0_4_ = auVar106._0_4_ * (float)local_880._0_4_;
      auVar47._8_4_ = auVar106._8_4_ * fStack_878;
      auVar47._12_4_ = auVar106._12_4_ * fStack_874;
      auVar47._16_4_ = auVar106._16_4_ * fStack_870;
      auVar47._20_4_ = auVar106._20_4_ * fStack_86c;
      auVar47._24_4_ = auVar106._24_4_ * fStack_868;
      auVar47._28_4_ = auVar107._28_4_;
      auVar107 = vsubps_avx(local_aa0,auVar47);
      uVar21 = vcmpps_avx512vl(auVar107,ZEXT832(0) << 0x20,5);
      bVar77 = (byte)uVar21;
      auVar287 = ZEXT3264(local_b20);
      auVar288 = ZEXT3264(local_b40);
      auVar289 = ZEXT3264(local_b60);
      if (bVar77 == 0) {
        bVar77 = 0;
        auVar108 = ZEXT832(0) << 0x20;
        auVar177 = ZEXT864(0) << 0x20;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar273 = ZEXT864(0) << 0x20;
        auVar131._8_4_ = 0x7f800000;
        auVar131._0_8_ = 0x7f8000007f800000;
        auVar131._12_4_ = 0x7f800000;
        auVar131._16_4_ = 0x7f800000;
        auVar131._20_4_ = 0x7f800000;
        auVar131._24_4_ = 0x7f800000;
        auVar131._28_4_ = 0x7f800000;
        auVar143._8_4_ = 0xff800000;
        auVar143._0_8_ = 0xff800000ff800000;
        auVar143._12_4_ = 0xff800000;
        auVar143._16_4_ = 0xff800000;
        auVar143._20_4_ = 0xff800000;
        auVar143._24_4_ = 0xff800000;
        auVar143._28_4_ = 0xff800000;
      }
      else {
        auVar95 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
        uVar85 = vcmpps_avx512vl(auVar107,auVar122,5);
        auVar107 = vsqrtps_avx(auVar107);
        auVar113 = vfnmadd213ps_avx512vl(auVar131,local_a60,auVar126);
        auVar124 = vfmadd132ps_avx512vl(auVar113,local_a60,local_a60);
        auVar113 = vsubps_avx(local_8a0,auVar107);
        auVar125 = vmulps_avx512vl(auVar113,auVar124);
        auVar107 = vsubps_avx512vl(auVar107,auVar130);
        auVar124 = vmulps_avx512vl(auVar107,auVar124);
        auVar107 = vfmadd213ps_avx512vl(auVar129,auVar125,auVar112);
        auVar48._4_4_ = fVar247 * auVar107._4_4_;
        auVar48._0_4_ = fVar241 * auVar107._0_4_;
        auVar48._8_4_ = fVar248 * auVar107._8_4_;
        auVar48._12_4_ = fVar249 * auVar107._12_4_;
        auVar48._16_4_ = fVar250 * auVar107._16_4_;
        auVar48._20_4_ = fVar266 * auVar107._20_4_;
        auVar48._24_4_ = fVar270 * auVar107._24_4_;
        auVar48._28_4_ = auVar114._28_4_;
        auVar49._4_4_ = (float)local_820._4_4_ * auVar125._4_4_;
        auVar49._0_4_ = (float)local_820._0_4_ * auVar125._0_4_;
        auVar49._8_4_ = fStack_818 * auVar125._8_4_;
        auVar49._12_4_ = fStack_814 * auVar125._12_4_;
        auVar49._16_4_ = fStack_810 * auVar125._16_4_;
        auVar49._20_4_ = fStack_80c * auVar125._20_4_;
        auVar49._24_4_ = fStack_808 * auVar125._24_4_;
        auVar49._28_4_ = auVar107._28_4_;
        auVar113 = vmulps_avx512vl(local_840,auVar125);
        auVar118 = vmulps_avx512vl(local_860,auVar125);
        auVar107 = vfmadd213ps_avx512vl(auVar108,auVar48,auVar115);
        auVar107 = vsubps_avx512vl(auVar49,auVar107);
        auVar114 = vfmadd213ps_avx512vl(auVar109,auVar48,auVar116);
        auVar114 = vsubps_avx512vl(auVar113,auVar114);
        auVar93 = vfmadd213ps_fma(auVar48,auVar111,auVar117);
        auVar113 = vsubps_avx(auVar118,ZEXT1632(auVar93));
        auVar273 = ZEXT3264(auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar129,auVar124,auVar112);
        auVar110 = vmulps_avx512vl(auVar110,auVar112);
        auVar50._4_4_ = (float)local_820._4_4_ * auVar124._4_4_;
        auVar50._0_4_ = (float)local_820._0_4_ * auVar124._0_4_;
        auVar50._8_4_ = fStack_818 * auVar124._8_4_;
        auVar50._12_4_ = fStack_814 * auVar124._12_4_;
        auVar50._16_4_ = fStack_810 * auVar124._16_4_;
        auVar50._20_4_ = fStack_80c * auVar124._20_4_;
        auVar50._24_4_ = fStack_808 * auVar124._24_4_;
        auVar50._28_4_ = auVar118._28_4_;
        auVar112 = vmulps_avx512vl(local_840,auVar124);
        auVar118 = vmulps_avx512vl(local_860,auVar124);
        auVar93 = vfmadd213ps_fma(auVar108,auVar110,auVar115);
        auVar113 = vsubps_avx(auVar50,ZEXT1632(auVar93));
        auVar93 = vfmadd213ps_fma(auVar109,auVar110,auVar116);
        auVar108 = vsubps_avx512vl(auVar112,ZEXT1632(auVar93));
        auVar93 = vfmadd213ps_fma(auVar111,auVar110,auVar117);
        auVar109 = vsubps_avx512vl(auVar118,ZEXT1632(auVar93));
        auVar177 = ZEXT3264(auVar109);
        auVar169._8_4_ = 0x7f800000;
        auVar169._0_8_ = 0x7f8000007f800000;
        auVar169._12_4_ = 0x7f800000;
        auVar169._16_4_ = 0x7f800000;
        auVar169._20_4_ = 0x7f800000;
        auVar169._24_4_ = 0x7f800000;
        auVar169._28_4_ = 0x7f800000;
        auVar109 = vblendmps_avx512vl(auVar169,auVar125);
        bVar6 = (bool)((byte)uVar85 & 1);
        auVar131._0_4_ = (uint)bVar6 * auVar109._0_4_ | (uint)!bVar6 * auVar115._0_4_;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar6 * auVar109._4_4_ | (uint)!bVar6 * auVar115._4_4_;
        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar6 * auVar109._8_4_ | (uint)!bVar6 * auVar115._8_4_;
        bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar6 * auVar109._12_4_ | (uint)!bVar6 * auVar115._12_4_;
        bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar6 * auVar109._16_4_ | (uint)!bVar6 * auVar115._16_4_;
        bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar6 * auVar109._20_4_ | (uint)!bVar6 * auVar115._20_4_;
        bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar6 * auVar109._24_4_ | (uint)!bVar6 * auVar115._24_4_;
        bVar6 = SUB81(uVar85 >> 7,0);
        auVar131._28_4_ = (uint)bVar6 * auVar109._28_4_ | (uint)!bVar6 * auVar115._28_4_;
        auVar170._8_4_ = 0xff800000;
        auVar170._0_8_ = 0xff800000ff800000;
        auVar170._12_4_ = 0xff800000;
        auVar170._16_4_ = 0xff800000;
        auVar170._20_4_ = 0xff800000;
        auVar170._24_4_ = 0xff800000;
        auVar170._28_4_ = 0xff800000;
        auVar109 = vblendmps_avx512vl(auVar170,auVar124);
        bVar6 = (bool)((byte)uVar85 & 1);
        auVar143._0_4_ = (uint)bVar6 * auVar109._0_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar6 * auVar109._4_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar6 * auVar109._8_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar6 * auVar109._12_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar143._16_4_ = (uint)bVar6 * auVar109._16_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar143._20_4_ = (uint)bVar6 * auVar109._20_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar143._24_4_ = (uint)bVar6 * auVar109._24_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = SUB81(uVar85 >> 7,0);
        auVar143._28_4_ = (uint)bVar6 * auVar109._28_4_ | (uint)!bVar6 * -0x800000;
        auVar36._8_4_ = 0x36000000;
        auVar36._0_8_ = 0x3600000036000000;
        auVar36._12_4_ = 0x36000000;
        auVar36._16_4_ = 0x36000000;
        auVar36._20_4_ = 0x36000000;
        auVar36._24_4_ = 0x36000000;
        auVar36._28_4_ = 0x36000000;
        auVar109 = vmulps_avx512vl(local_8e0,auVar36);
        uVar81 = vcmpps_avx512vl(auVar109,local_a40,0xe);
        uVar85 = uVar85 & uVar81;
        bVar78 = (byte)uVar85;
        if (bVar78 != 0) {
          uVar81 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar95),2);
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar279._8_4_ = 0xff800000;
          auVar279._0_8_ = 0xff800000ff800000;
          auVar279._12_4_ = 0xff800000;
          auVar279._16_4_ = 0xff800000;
          auVar279._20_4_ = 0xff800000;
          auVar279._24_4_ = 0xff800000;
          auVar279._28_4_ = 0xff800000;
          auVar106 = vblendmps_avx512vl(auVar264,auVar279);
          bVar84 = (byte)uVar81;
          uVar86 = (uint)(bVar84 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar109._0_4_;
          bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
          uVar152 = (uint)bVar6 * auVar106._4_4_ | (uint)!bVar6 * auVar109._4_4_;
          bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
          uVar153 = (uint)bVar6 * auVar106._8_4_ | (uint)!bVar6 * auVar109._8_4_;
          bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
          uVar154 = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * auVar109._12_4_;
          bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
          uVar155 = (uint)bVar6 * auVar106._16_4_ | (uint)!bVar6 * auVar109._16_4_;
          bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
          uVar156 = (uint)bVar6 * auVar106._20_4_ | (uint)!bVar6 * auVar109._20_4_;
          bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
          uVar157 = (uint)bVar6 * auVar106._24_4_ | (uint)!bVar6 * auVar109._24_4_;
          bVar6 = SUB81(uVar81 >> 7,0);
          uVar158 = (uint)bVar6 * auVar106._28_4_ | (uint)!bVar6 * auVar109._28_4_;
          auVar131._0_4_ = (bVar78 & 1) * uVar86 | !(bool)(bVar78 & 1) * auVar131._0_4_;
          bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar131._4_4_ = bVar6 * uVar152 | !bVar6 * auVar131._4_4_;
          bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar131._8_4_ = bVar6 * uVar153 | !bVar6 * auVar131._8_4_;
          bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar131._12_4_ = bVar6 * uVar154 | !bVar6 * auVar131._12_4_;
          bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar131._16_4_ = bVar6 * uVar155 | !bVar6 * auVar131._16_4_;
          bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar131._20_4_ = bVar6 * uVar156 | !bVar6 * auVar131._20_4_;
          bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar131._24_4_ = bVar6 * uVar157 | !bVar6 * auVar131._24_4_;
          bVar6 = SUB81(uVar85 >> 7,0);
          auVar131._28_4_ = bVar6 * uVar158 | !bVar6 * auVar131._28_4_;
          auVar106 = vblendmps_avx512vl(auVar279,auVar264);
          bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar81 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar81 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar81 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar81 >> 6) & 1);
          bVar13 = SUB81(uVar81 >> 7,0);
          auVar143._0_4_ =
               (uint)(bVar78 & 1) *
               ((uint)(bVar84 & 1) * auVar106._0_4_ | !(bool)(bVar84 & 1) * uVar86) |
               !(bool)(bVar78 & 1) * auVar143._0_4_;
          bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar143._4_4_ =
               (uint)bVar7 * ((uint)bVar6 * auVar106._4_4_ | !bVar6 * uVar152) |
               !bVar7 * auVar143._4_4_;
          bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar143._8_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar106._8_4_ | !bVar8 * uVar153) |
               !bVar6 * auVar143._8_4_;
          bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar143._12_4_ =
               (uint)bVar6 * ((uint)bVar9 * auVar106._12_4_ | !bVar9 * uVar154) |
               !bVar6 * auVar143._12_4_;
          bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar143._16_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar106._16_4_ | !bVar10 * uVar155) |
               !bVar6 * auVar143._16_4_;
          bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar143._20_4_ =
               (uint)bVar6 * ((uint)bVar11 * auVar106._20_4_ | !bVar11 * uVar156) |
               !bVar6 * auVar143._20_4_;
          bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar143._24_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar106._24_4_ | !bVar12 * uVar157) |
               !bVar6 * auVar143._24_4_;
          bVar6 = SUB81(uVar85 >> 7,0);
          auVar143._28_4_ =
               (uint)bVar6 * ((uint)bVar13 * auVar106._28_4_ | !bVar13 * uVar158) |
               !bVar6 * auVar143._28_4_;
          bVar77 = (~bVar78 | bVar84) & bVar77;
        }
      }
      auVar275._0_4_ = local_860._0_4_ * auVar177._0_4_;
      auVar275._4_4_ = local_860._4_4_ * auVar177._4_4_;
      auVar275._8_4_ = local_860._8_4_ * auVar177._8_4_;
      auVar275._12_4_ = local_860._12_4_ * auVar177._12_4_;
      auVar275._16_4_ = local_860._16_4_ * auVar177._16_4_;
      auVar275._20_4_ = local_860._20_4_ * auVar177._20_4_;
      auVar275._28_36_ = auVar177._28_36_;
      auVar275._24_4_ = local_860._24_4_ * auVar177._24_4_;
      auVar269 = ZEXT3264(local_840);
      auVar93 = vfmadd231ps_fma(auVar275._0_32_,local_840,auVar108);
      auVar265 = ZEXT3264(_local_820);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),_local_820,auVar113);
      auVar275 = ZEXT3264(_local_900);
      _local_540 = _local_900;
      local_520 = vminps_avx(local_6c0,auVar131);
      auVar260._8_4_ = 0x7fffffff;
      auVar260._0_8_ = 0x7fffffff7fffffff;
      auVar260._12_4_ = 0x7fffffff;
      auVar260._16_4_ = 0x7fffffff;
      auVar260._20_4_ = 0x7fffffff;
      auVar260._24_4_ = 0x7fffffff;
      auVar260._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(ZEXT1632(auVar93),auVar260);
      local_6e0 = vmaxps_avx(_local_900,auVar143);
      auVar172._8_4_ = 0x3e99999a;
      auVar172._0_8_ = 0x3e99999a3e99999a;
      auVar172._12_4_ = 0x3e99999a;
      auVar172._16_4_ = 0x3e99999a;
      auVar172._20_4_ = 0x3e99999a;
      auVar172._24_4_ = 0x3e99999a;
      auVar172._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar106,auVar172,1);
      local_760._0_2_ = (short)uVar21;
      uVar21 = vcmpps_avx512vl(_local_900,local_520,2);
      bVar78 = (byte)uVar21 & bVar74;
      uVar22 = vcmpps_avx512vl(local_6e0,local_6c0,2);
      auVar285 = ZEXT3264(local_ae0);
      auVar286 = ZEXT3264(local_b00);
      if ((bVar74 & ((byte)uVar22 | (byte)uVar21)) == 0) {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar177 = ZEXT3264(auVar106);
      }
      else {
        auVar51._4_4_ = local_860._4_4_ * auVar273._4_4_;
        auVar51._0_4_ = local_860._0_4_ * auVar273._0_4_;
        auVar51._8_4_ = local_860._8_4_ * auVar273._8_4_;
        auVar51._12_4_ = local_860._12_4_ * auVar273._12_4_;
        auVar51._16_4_ = local_860._16_4_ * auVar273._16_4_;
        auVar51._20_4_ = local_860._20_4_ * auVar273._20_4_;
        auVar51._24_4_ = local_860._24_4_ * auVar273._24_4_;
        auVar51._28_4_ = 0x3e99999a;
        auVar93 = vfmadd213ps_fma(auVar114,local_840,auVar51);
        auVar93 = vfmadd213ps_fma(auVar107,_local_820,ZEXT1632(auVar93));
        auVar106 = vandps_avx(ZEXT1632(auVar93),auVar260);
        uVar21 = vcmpps_avx512vl(auVar106,auVar172,1);
        bVar84 = (byte)uVar21 | ~bVar77;
        auVar173._8_4_ = 2;
        auVar173._0_8_ = 0x200000002;
        auVar173._12_4_ = 2;
        auVar173._16_4_ = 2;
        auVar173._20_4_ = 2;
        auVar173._24_4_ = 2;
        auVar173._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar173,auVar37);
        local_680._0_4_ = (uint)(bVar84 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
        bVar6 = (bool)(bVar84 >> 1 & 1);
        local_680._4_4_ = (uint)bVar6 * auVar106._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar84 >> 2 & 1);
        local_680._8_4_ = (uint)bVar6 * auVar106._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar84 >> 3 & 1);
        local_680._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar84 >> 4 & 1);
        local_680._16_4_ = (uint)bVar6 * auVar106._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar84 >> 5 & 1);
        local_680._20_4_ = (uint)bVar6 * auVar106._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar84 >> 6 & 1);
        local_680._24_4_ = (uint)bVar6 * auVar106._24_4_ | (uint)!bVar6 * 2;
        local_680._28_4_ = (uint)(bVar84 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar84 >> 7) * 2;
        local_700 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_700,local_680,5);
        bVar84 = (byte)uVar21 & bVar78;
        if (bVar84 == 0) {
          auVar175._4_4_ = uVar87;
          auVar175._0_4_ = uVar87;
          auVar175._8_4_ = uVar87;
          auVar175._12_4_ = uVar87;
          auVar175._16_4_ = uVar87;
          auVar175._20_4_ = uVar87;
          auVar175._24_4_ = uVar87;
          auVar175._28_4_ = uVar87;
          auVar106 = local_6e0;
        }
        else {
          local_6a0 = local_6e0;
          auVar95 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar93 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar20 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar94 = vminps_avx(auVar95,auVar20);
          auVar95 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar20 = vmaxps_avx(auVar93,auVar95);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar94,auVar203);
          auVar95 = vandps_avx(auVar20,auVar203);
          auVar93 = vmaxps_avx(auVar93,auVar95);
          auVar95 = vmovshdup_avx(auVar93);
          auVar95 = vmaxss_avx(auVar95,auVar93);
          auVar93 = vshufpd_avx(auVar93,auVar93,1);
          auVar93 = vmaxss_avx(auVar93,auVar95);
          fVar218 = auVar93._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar20,auVar20,0xff);
          local_740 = (float)local_900._0_4_ + (float)local_a00._0_4_;
          fStack_73c = (float)local_900._4_4_ + (float)local_a00._4_4_;
          fStack_738 = fStack_8f8 + fStack_9f8;
          fStack_734 = fStack_8f4 + fStack_9f4;
          fStack_730 = fStack_8f0 + fStack_9f0;
          fStack_72c = fStack_8ec + fStack_9ec;
          fStack_728 = fStack_8e8 + fStack_9e8;
          fStack_724 = fStack_8e4 + fStack_9e4;
          do {
            auVar174._8_4_ = 0x7f800000;
            auVar174._0_8_ = 0x7f8000007f800000;
            auVar174._12_4_ = 0x7f800000;
            auVar174._16_4_ = 0x7f800000;
            auVar174._20_4_ = 0x7f800000;
            auVar174._24_4_ = 0x7f800000;
            auVar174._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar174,_local_900);
            auVar145._0_4_ =
                 (uint)(bVar84 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar84 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar6 * auVar106._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar84 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar6 * auVar106._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar84 >> 3 & 1);
            auVar145._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar84 >> 4 & 1);
            auVar145._16_4_ = (uint)bVar6 * auVar106._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar84 >> 5 & 1);
            auVar145._20_4_ = (uint)bVar6 * auVar106._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar145._24_4_ =
                 (uint)(bVar84 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar145,auVar145,0xb1);
            auVar106 = vminps_avx(auVar145,auVar106);
            auVar107 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar107);
            auVar107 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar107);
            uVar21 = vcmpps_avx512vl(auVar145,auVar106,0);
            bVar75 = (byte)uVar21 & bVar84;
            bVar76 = bVar84;
            if (bVar75 != 0) {
              bVar76 = bVar75;
            }
            iVar24 = 0;
            for (uVar87 = (uint)bVar76; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            uVar87 = *(uint *)(local_4e0 + (uint)(iVar24 << 2));
            uVar86 = *(uint *)(local_540 + (uint)(iVar24 << 2));
            fVar235 = auVar90._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar235 = sqrtf((float)local_a20._0_4_);
            }
            auVar93 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar87),0x10);
            auVar177 = ZEXT1664(auVar93);
            lVar83 = 5;
            do {
              uVar179 = auVar177._0_4_;
              auVar162._4_4_ = uVar179;
              auVar162._0_4_ = uVar179;
              auVar162._8_4_ = uVar179;
              auVar162._12_4_ = uVar179;
              auVar93 = vfmadd132ps_fma(auVar162,ZEXT816(0) << 0x40,local_a10);
              auVar95 = vmovshdup_avx(auVar177._0_16_);
              fVar241 = auVar95._0_4_;
              fVar240 = 1.0 - fVar241;
              fVar236 = fVar241 * fVar241;
              auVar97 = SUB6416(ZEXT464(0x40400000),0);
              auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar94 = vfmadd213ss_fma(auVar97,auVar95,auVar96);
              auVar20 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar236),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar100 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar240),auVar96);
              auVar100 = vfmadd213ss_fma(auVar100,ZEXT416((uint)(fVar240 * fVar240)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar237 = fVar240 * fVar240 * -fVar241 * 0.5;
              fVar238 = auVar20._0_4_ * 0.5;
              fVar159 = auVar100._0_4_ * 0.5;
              fVar239 = fVar241 * fVar241 * -fVar240 * 0.5;
              auVar221._0_4_ = fVar239 * (float)local_9e0._0_4_;
              auVar221._4_4_ = fVar239 * (float)local_9e0._4_4_;
              auVar221._8_4_ = fVar239 * fStack_9d8;
              auVar221._12_4_ = fVar239 * fStack_9d4;
              auVar244._4_4_ = fVar159;
              auVar244._0_4_ = fVar159;
              auVar244._8_4_ = fVar159;
              auVar244._12_4_ = fVar159;
              auVar20 = vfmadd132ps_fma(auVar244,auVar221,local_9a0._0_16_);
              auVar204._4_4_ = fVar238;
              auVar204._0_4_ = fVar238;
              auVar204._8_4_ = fVar238;
              auVar204._12_4_ = fVar238;
              auVar20 = vfmadd132ps_fma(auVar204,auVar20,local_9c0._0_16_);
              auVar222._4_4_ = fVar237;
              auVar222._0_4_ = fVar237;
              auVar222._8_4_ = fVar237;
              auVar222._12_4_ = fVar237;
              auVar20 = vfmadd132ps_fma(auVar222,auVar20,local_980._0_16_);
              auVar100 = vfmadd231ss_fma(auVar96,auVar95,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar100;
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar95,ZEXT416(0x40800000))
              ;
              local_8c0._0_16_ = auVar100;
              auVar100 = vfmadd213ss_fma(auVar97,auVar95,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar100;
              _local_880 = auVar20;
              auVar20 = vsubps_avx(auVar93,auVar20);
              auVar93 = vdpps_avx(auVar20,auVar20,0x7f);
              fVar237 = auVar93._0_4_;
              local_800 = auVar177;
              if (fVar237 < 0.0) {
                local_aa0._0_4_ = auVar94._0_4_;
                local_ac0._0_16_ = ZEXT416((uint)fVar240);
                local_a40._0_4_ = fVar236;
                local_a60._0_4_ = fVar240 * -2.0;
                auVar177._0_4_ = sqrtf(fVar237);
                auVar177._4_60_ = extraout_var;
                auVar94 = ZEXT416((uint)local_aa0._0_4_);
                auVar100 = auVar177._0_16_;
                auVar96 = local_ac0._0_16_;
              }
              else {
                auVar100 = vsqrtss_avx(auVar93,auVar93);
                local_a60._0_4_ = fVar240 * -2.0;
                local_a40._0_4_ = fVar236;
                auVar96 = ZEXT416((uint)fVar240);
              }
              fVar236 = auVar96._0_4_;
              auVar98 = vfnmadd231ss_fma(ZEXT416((uint)(fVar241 * (fVar236 + fVar236))),auVar96,
                                         auVar96);
              auVar94 = vfmadd213ss_fma(auVar94,ZEXT416((uint)(fVar241 + fVar241)),
                                        ZEXT416((uint)(fVar241 * fVar241 * 3.0)));
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar95,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar236 * -3.0)),
                                        ZEXT416((uint)(fVar236 + fVar236)),auVar96);
              auVar96 = vfmadd213ss_fma(ZEXT416((uint)local_a60._0_4_),auVar95,
                                        ZEXT416((uint)local_a40._0_4_));
              fVar236 = auVar98._0_4_ * 0.5;
              fVar238 = auVar94._0_4_ * 0.5;
              fVar159 = auVar97._0_4_ * 0.5;
              fVar239 = auVar96._0_4_ * 0.5;
              auVar223._0_4_ = fVar239 * (float)local_9e0._0_4_;
              auVar223._4_4_ = fVar239 * (float)local_9e0._4_4_;
              auVar223._8_4_ = fVar239 * fStack_9d8;
              auVar223._12_4_ = fVar239 * fStack_9d4;
              auVar205._4_4_ = fVar159;
              auVar205._0_4_ = fVar159;
              auVar205._8_4_ = fVar159;
              auVar205._12_4_ = fVar159;
              auVar94 = vfmadd132ps_fma(auVar205,auVar223,local_9a0._0_16_);
              auVar183._4_4_ = fVar238;
              auVar183._0_4_ = fVar238;
              auVar183._8_4_ = fVar238;
              auVar183._12_4_ = fVar238;
              auVar94 = vfmadd132ps_fma(auVar183,auVar94,local_9c0._0_16_);
              auVar277._4_4_ = fVar236;
              auVar277._0_4_ = fVar236;
              auVar277._8_4_ = fVar236;
              auVar277._12_4_ = fVar236;
              local_aa0._0_16_ = vfmadd132ps_fma(auVar277,auVar94,local_980._0_16_);
              local_a40._0_16_ = vdpps_avx(local_aa0._0_16_,local_aa0._0_16_,0x7f);
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT812(0);
              fVar236 = local_a40._0_4_;
              auVar94 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar236));
              fVar238 = auVar94._0_4_;
              local_a60._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar236));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar96 = vxorps_avx512vl(local_a40._0_16_,auVar26);
              auVar94 = vfnmadd213ss_fma(local_a60._0_16_,local_a40._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_a80._0_4_ = auVar94._0_4_;
              local_ac0._0_4_ = auVar100._0_4_;
              if (fVar236 < auVar96._0_4_) {
                fVar159 = sqrtf(fVar236);
                auVar100 = ZEXT416((uint)local_ac0._0_4_);
                auVar94 = local_aa0._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                fVar159 = auVar94._0_4_;
                auVar94 = local_aa0._0_16_;
              }
              fVar236 = fVar238 * 1.5 + fVar236 * -0.5 * fVar238 * fVar238 * fVar238;
              auVar163._0_4_ = auVar94._0_4_ * fVar236;
              auVar163._4_4_ = auVar94._4_4_ * fVar236;
              auVar163._8_4_ = auVar94._8_4_ * fVar236;
              auVar163._12_4_ = auVar94._12_4_ * fVar236;
              auVar96 = vdpps_avx(auVar20,auVar163,0x7f);
              fVar240 = auVar100._0_4_;
              fVar238 = auVar96._0_4_;
              auVar164._0_4_ = fVar238 * fVar238;
              auVar164._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar164._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar164._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar97 = vsubps_avx512vl(auVar93,auVar164);
              fVar239 = auVar97._0_4_;
              auVar184._4_12_ = ZEXT812(0) << 0x20;
              auVar184._0_4_ = fVar239;
              auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              auVar91 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
              if (fVar239 < 0.0) {
                local_930 = fVar236;
                fStack_92c = fVar236;
                fStack_928 = fVar236;
                fStack_924 = fVar236;
                local_920 = auVar98;
                fVar239 = sqrtf(fVar239);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar100 = ZEXT416((uint)local_ac0._0_4_);
                auVar97 = local_920;
                auVar94 = local_aa0._0_16_;
                fVar236 = local_930;
                fVar241 = fStack_92c;
                fVar247 = fStack_928;
                fVar248 = fStack_924;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
                fVar239 = auVar97._0_4_;
                auVar97 = auVar98;
                fVar241 = fVar236;
                fVar247 = fVar236;
                fVar248 = fVar236;
              }
              auVar273 = ZEXT1664(auVar20);
              auVar285 = ZEXT3264(local_ae0);
              auVar286 = ZEXT3264(local_b00);
              auVar287 = ZEXT3264(local_b20);
              auVar288 = ZEXT3264(local_b40);
              auVar289 = ZEXT3264(local_b60);
              auVar185._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar185._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar185._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar185._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar206._4_4_ = local_8c0._0_4_;
              auVar206._0_4_ = local_8c0._0_4_;
              auVar206._8_4_ = local_8c0._0_4_;
              auVar206._12_4_ = local_8c0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar206,auVar185,local_9a0._0_16_);
              auVar186._4_4_ = local_8a0._0_4_;
              auVar186._0_4_ = local_8a0._0_4_;
              auVar186._8_4_ = local_8a0._0_4_;
              auVar186._12_4_ = local_8a0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar186,auVar89,local_9c0._0_16_);
              auVar95 = vfmadd213ss_fma(auVar95,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar179 = auVar95._0_4_;
              auVar207._4_4_ = uVar179;
              auVar207._0_4_ = uVar179;
              auVar207._8_4_ = uVar179;
              auVar207._12_4_ = uVar179;
              auVar95 = vfmadd132ps_fma(auVar207,auVar89,local_980._0_16_);
              auVar187._0_4_ = auVar95._0_4_ * (float)local_a40._0_4_;
              auVar187._4_4_ = auVar95._4_4_ * (float)local_a40._0_4_;
              auVar187._8_4_ = auVar95._8_4_ * (float)local_a40._0_4_;
              auVar187._12_4_ = auVar95._12_4_ * (float)local_a40._0_4_;
              auVar95 = vdpps_avx(auVar94,auVar95,0x7f);
              fVar249 = auVar95._0_4_;
              auVar208._0_4_ = auVar94._0_4_ * fVar249;
              auVar208._4_4_ = auVar94._4_4_ * fVar249;
              auVar208._8_4_ = auVar94._8_4_ * fVar249;
              auVar208._12_4_ = auVar94._12_4_ * fVar249;
              auVar95 = vsubps_avx(auVar187,auVar208);
              fVar249 = (float)local_a80._0_4_ * (float)local_a60._0_4_;
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar218),
                                   ZEXT416((uint)(local_800._0_4_ * fVar235 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar149._16_48_ = local_800._16_48_;
              auVar99 = vxorps_avx512vl(auVar94,auVar27);
              auVar188._0_4_ = fVar236 * auVar95._0_4_ * fVar249;
              auVar188._4_4_ = fVar241 * auVar95._4_4_ * fVar249;
              auVar188._8_4_ = fVar247 * auVar95._8_4_ * fVar249;
              auVar188._12_4_ = fVar248 * auVar95._12_4_ * fVar249;
              auVar275 = ZEXT1664(auVar163);
              auVar95 = vdpps_avx(auVar99,auVar163,0x7f);
              auVar88 = vfmadd213ss_fma(auVar100,ZEXT416((uint)fVar218),auVar89);
              auVar100 = vdpps_avx(auVar20,auVar188,0x7f);
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 + 1.0)),
                                        ZEXT416((uint)(fVar218 / fVar159)),auVar88);
              fVar236 = auVar95._0_4_ + auVar100._0_4_;
              auVar95 = vdpps_avx(local_a10,auVar163,0x7f);
              auVar100 = vdpps_avx(auVar20,auVar99,0x7f);
              auVar91 = vmulss_avx512f(auVar91,auVar97);
              fVar159 = auVar98._0_4_ * 1.5 + auVar91._0_4_ * auVar97._0_4_ * auVar97._0_4_;
              auVar97 = vdpps_avx(auVar20,local_a10,0x7f);
              auVar91 = vfnmadd231ss_fma(auVar100,auVar96,ZEXT416((uint)fVar236));
              auVar97 = vfnmadd231ss_fma(auVar97,auVar96,auVar95);
              auVar100 = vpermilps_avx(_local_880,0xff);
              fVar239 = fVar239 - auVar100._0_4_;
              auVar98 = vshufps_avx(auVar94,auVar94,0xff);
              auVar100 = vfmsub213ss_fma(auVar91,ZEXT416((uint)fVar159),auVar98);
              auVar267._8_4_ = 0x80000000;
              auVar267._0_8_ = 0x8000000080000000;
              auVar267._12_4_ = 0x80000000;
              auVar269 = ZEXT1664(auVar267);
              auVar262._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
              auVar262._8_4_ = auVar100._8_4_ ^ 0x80000000;
              auVar262._12_4_ = auVar100._12_4_ ^ 0x80000000;
              auVar265 = ZEXT1664(auVar262);
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * fVar159));
              auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar100._0_4_)),
                                        ZEXT416((uint)fVar236),auVar97);
              auVar100 = vinsertps_avx(auVar262,auVar97,0x1c);
              auVar253._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
              auVar253._8_4_ = auVar95._8_4_ ^ 0x80000000;
              auVar253._12_4_ = auVar95._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar236),auVar253,0x10);
              auVar224._0_4_ = auVar91._0_4_;
              auVar224._4_4_ = auVar224._0_4_;
              auVar224._8_4_ = auVar224._0_4_;
              auVar224._12_4_ = auVar224._0_4_;
              auVar95 = vdivps_avx(auVar100,auVar224);
              auVar100 = vdivps_avx(auVar97,auVar224);
              auVar225._0_4_ = fVar238 * auVar95._0_4_ + fVar239 * auVar100._0_4_;
              auVar225._4_4_ = fVar238 * auVar95._4_4_ + fVar239 * auVar100._4_4_;
              auVar225._8_4_ = fVar238 * auVar95._8_4_ + fVar239 * auVar100._8_4_;
              auVar225._12_4_ = fVar238 * auVar95._12_4_ + fVar239 * auVar100._12_4_;
              auVar95 = vsubps_avx(local_800._0_16_,auVar225);
              auVar177 = ZEXT1664(auVar95);
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar100 = vandps_avx512vl(auVar96,auVar28);
              if (auVar100._0_4_ < auVar88._0_4_) {
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar89._0_4_)),local_940,
                                           ZEXT416(0x36000000));
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar96 = vandps_avx512vl(ZEXT416((uint)fVar239),auVar29);
                if (auVar96._0_4_ < auVar100._0_4_) {
                  fVar235 = auVar95._0_4_ + (float)local_950._0_4_;
                  if ((fVar235 < fVar178) ||
                     (fVar236 = *(float *)(ray + k * 4 + 0x200), fVar236 < fVar235)) break;
                  auVar95 = vmovshdup_avx(auVar95);
                  fVar238 = auVar95._0_4_;
                  if ((fVar238 < 0.0) || (1.0 < fVar238)) break;
                  auVar53._12_4_ = 0;
                  auVar53._0_12_ = ZEXT412(0);
                  auVar149._4_12_ = ZEXT412(0);
                  auVar149._0_4_ = fVar237;
                  auVar95 = vrsqrt14ss_avx512f(auVar53 << 0x20,auVar149._0_16_);
                  fVar237 = auVar95._0_4_;
                  auVar93 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar237 = fVar237 * 1.5 + auVar93._0_4_ * fVar237 * fVar237 * fVar237;
                  auVar226._0_4_ = auVar20._0_4_ * fVar237;
                  auVar226._4_4_ = auVar20._4_4_ * fVar237;
                  auVar226._8_4_ = auVar20._8_4_ * fVar237;
                  auVar226._12_4_ = auVar20._12_4_ * fVar237;
                  auVar100 = vfmadd213ps_fma(auVar98,auVar226,auVar94);
                  auVar93 = vshufps_avx(auVar226,auVar226,0xc9);
                  auVar95 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar227._0_4_ = auVar226._0_4_ * auVar95._0_4_;
                  auVar227._4_4_ = auVar226._4_4_ * auVar95._4_4_;
                  auVar227._8_4_ = auVar226._8_4_ * auVar95._8_4_;
                  auVar227._12_4_ = auVar226._12_4_ * auVar95._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar227,auVar94,auVar93);
                  auVar93 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar95 = vshufps_avx(auVar100,auVar100,0xc9);
                  auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                  auVar189._0_4_ = auVar100._0_4_ * auVar94._0_4_;
                  auVar189._4_4_ = auVar100._4_4_ * auVar94._4_4_;
                  auVar189._8_4_ = auVar100._8_4_ * auVar94._8_4_;
                  auVar189._12_4_ = auVar100._12_4_ * auVar94._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar189,auVar93,auVar95);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar235;
                    uVar179 = vextractps_avx(auVar93,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar179;
                    uVar179 = vextractps_avx(auVar93,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar179;
                    *(int *)(ray + k * 4 + 0x380) = auVar93._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar238;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar2;
                    *(uint *)(ray + k * 4 + 0x480) = uVar82;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar5 = context->user;
                  auVar151 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar151,auVar177);
                  auVar177 = vpermps_avx512f(auVar151,ZEXT1664(auVar93));
                  auVar151 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar151,ZEXT1664(auVar93));
                  local_380 = vbroadcastss_avx512f(auVar93);
                  local_400[0] = (RTCHitN)auVar177[0];
                  local_400[1] = (RTCHitN)auVar177[1];
                  local_400[2] = (RTCHitN)auVar177[2];
                  local_400[3] = (RTCHitN)auVar177[3];
                  local_400[4] = (RTCHitN)auVar177[4];
                  local_400[5] = (RTCHitN)auVar177[5];
                  local_400[6] = (RTCHitN)auVar177[6];
                  local_400[7] = (RTCHitN)auVar177[7];
                  local_400[8] = (RTCHitN)auVar177[8];
                  local_400[9] = (RTCHitN)auVar177[9];
                  local_400[10] = (RTCHitN)auVar177[10];
                  local_400[0xb] = (RTCHitN)auVar177[0xb];
                  local_400[0xc] = (RTCHitN)auVar177[0xc];
                  local_400[0xd] = (RTCHitN)auVar177[0xd];
                  local_400[0xe] = (RTCHitN)auVar177[0xe];
                  local_400[0xf] = (RTCHitN)auVar177[0xf];
                  local_400[0x10] = (RTCHitN)auVar177[0x10];
                  local_400[0x11] = (RTCHitN)auVar177[0x11];
                  local_400[0x12] = (RTCHitN)auVar177[0x12];
                  local_400[0x13] = (RTCHitN)auVar177[0x13];
                  local_400[0x14] = (RTCHitN)auVar177[0x14];
                  local_400[0x15] = (RTCHitN)auVar177[0x15];
                  local_400[0x16] = (RTCHitN)auVar177[0x16];
                  local_400[0x17] = (RTCHitN)auVar177[0x17];
                  local_400[0x18] = (RTCHitN)auVar177[0x18];
                  local_400[0x19] = (RTCHitN)auVar177[0x19];
                  local_400[0x1a] = (RTCHitN)auVar177[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar177[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar177[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar177[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar177[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar177[0x1f];
                  local_400[0x20] = (RTCHitN)auVar177[0x20];
                  local_400[0x21] = (RTCHitN)auVar177[0x21];
                  local_400[0x22] = (RTCHitN)auVar177[0x22];
                  local_400[0x23] = (RTCHitN)auVar177[0x23];
                  local_400[0x24] = (RTCHitN)auVar177[0x24];
                  local_400[0x25] = (RTCHitN)auVar177[0x25];
                  local_400[0x26] = (RTCHitN)auVar177[0x26];
                  local_400[0x27] = (RTCHitN)auVar177[0x27];
                  local_400[0x28] = (RTCHitN)auVar177[0x28];
                  local_400[0x29] = (RTCHitN)auVar177[0x29];
                  local_400[0x2a] = (RTCHitN)auVar177[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar177[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar177[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar177[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar177[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar177[0x2f];
                  local_400[0x30] = (RTCHitN)auVar177[0x30];
                  local_400[0x31] = (RTCHitN)auVar177[0x31];
                  local_400[0x32] = (RTCHitN)auVar177[0x32];
                  local_400[0x33] = (RTCHitN)auVar177[0x33];
                  local_400[0x34] = (RTCHitN)auVar177[0x34];
                  local_400[0x35] = (RTCHitN)auVar177[0x35];
                  local_400[0x36] = (RTCHitN)auVar177[0x36];
                  local_400[0x37] = (RTCHitN)auVar177[0x37];
                  local_400[0x38] = (RTCHitN)auVar177[0x38];
                  local_400[0x39] = (RTCHitN)auVar177[0x39];
                  local_400[0x3a] = (RTCHitN)auVar177[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar177[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar177[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar177[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar177[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar177[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar177 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar177);
                  auVar106 = vpcmpeqd_avx2(auVar177._0_32_,auVar177._0_32_);
                  local_a68[3] = auVar106;
                  local_a68[2] = auVar106;
                  local_a68[1] = auVar106;
                  *local_a68 = auVar106;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar235;
                  auVar177 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar177);
                  local_b90.valid = (int *)local_7c0;
                  local_b90.geometryUserPtr = pGVar3->userPtr;
                  local_b90.context = context->user;
                  local_b90.hit = local_400;
                  local_b90.N = 0x10;
                  local_b90.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar265 = ZEXT1664(auVar262);
                    auVar269 = ZEXT1664(auVar267);
                    auVar273 = ZEXT1664(auVar20);
                    auVar275 = ZEXT1664(auVar163);
                    (*pGVar3->intersectionFilterN)(&local_b90);
                    auVar289 = ZEXT3264(local_b60);
                    auVar288 = ZEXT3264(local_b40);
                    auVar287 = ZEXT3264(local_b20);
                    auVar286 = ZEXT3264(local_b00);
                    auVar285 = ZEXT3264(local_ae0);
                    auVar177 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar21 = vptestmd_avx512f(auVar177,auVar177);
                  if ((short)uVar21 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      (*p_Var4)(&local_b90);
                      auVar289 = ZEXT3264(local_b60);
                      auVar288 = ZEXT3264(local_b40);
                      auVar287 = ZEXT3264(local_b20);
                      auVar286 = ZEXT3264(local_b00);
                      auVar285 = ZEXT3264(local_ae0);
                      auVar177 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar85 = vptestmd_avx512f(auVar177,auVar177);
                    if ((short)uVar85 != 0) {
                      iVar56 = *(int *)(local_b90.hit + 4);
                      iVar57 = *(int *)(local_b90.hit + 8);
                      iVar58 = *(int *)(local_b90.hit + 0xc);
                      iVar59 = *(int *)(local_b90.hit + 0x10);
                      iVar60 = *(int *)(local_b90.hit + 0x14);
                      iVar61 = *(int *)(local_b90.hit + 0x18);
                      iVar62 = *(int *)(local_b90.hit + 0x1c);
                      iVar63 = *(int *)(local_b90.hit + 0x20);
                      iVar64 = *(int *)(local_b90.hit + 0x24);
                      iVar65 = *(int *)(local_b90.hit + 0x28);
                      iVar66 = *(int *)(local_b90.hit + 0x2c);
                      iVar67 = *(int *)(local_b90.hit + 0x30);
                      iVar68 = *(int *)(local_b90.hit + 0x34);
                      iVar69 = *(int *)(local_b90.hit + 0x38);
                      iVar70 = *(int *)(local_b90.hit + 0x3c);
                      bVar76 = (byte)uVar85;
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar75 = (byte)(uVar85 >> 8);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x300) =
                           (uint)(bVar76 & 1) * *(int *)local_b90.hit |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x300);
                      *(uint *)(local_b90.ray + 0x304) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x304);
                      *(uint *)(local_b90.ray + 0x308) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x308);
                      *(uint *)(local_b90.ray + 0x30c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x30c);
                      *(uint *)(local_b90.ray + 0x310) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x310);
                      *(uint *)(local_b90.ray + 0x314) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x314);
                      *(uint *)(local_b90.ray + 0x318) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x318);
                      *(uint *)(local_b90.ray + 0x31c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x31c);
                      *(uint *)(local_b90.ray + 800) =
                           (uint)(bVar75 & 1) * iVar63 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 800);
                      *(uint *)(local_b90.ray + 0x324) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x324);
                      *(uint *)(local_b90.ray + 0x328) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x328);
                      *(uint *)(local_b90.ray + 0x32c) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x32c);
                      *(uint *)(local_b90.ray + 0x330) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x330);
                      *(uint *)(local_b90.ray + 0x334) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x334);
                      *(uint *)(local_b90.ray + 0x338) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x338);
                      *(uint *)(local_b90.ray + 0x33c) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x33c);
                      iVar56 = *(int *)(local_b90.hit + 0x44);
                      iVar57 = *(int *)(local_b90.hit + 0x48);
                      iVar58 = *(int *)(local_b90.hit + 0x4c);
                      iVar59 = *(int *)(local_b90.hit + 0x50);
                      iVar60 = *(int *)(local_b90.hit + 0x54);
                      iVar61 = *(int *)(local_b90.hit + 0x58);
                      iVar62 = *(int *)(local_b90.hit + 0x5c);
                      iVar63 = *(int *)(local_b90.hit + 0x60);
                      iVar64 = *(int *)(local_b90.hit + 100);
                      iVar65 = *(int *)(local_b90.hit + 0x68);
                      iVar66 = *(int *)(local_b90.hit + 0x6c);
                      iVar67 = *(int *)(local_b90.hit + 0x70);
                      iVar68 = *(int *)(local_b90.hit + 0x74);
                      iVar69 = *(int *)(local_b90.hit + 0x78);
                      iVar70 = *(int *)(local_b90.hit + 0x7c);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x340) =
                           (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0x40) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x340);
                      *(uint *)(local_b90.ray + 0x344) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x344);
                      *(uint *)(local_b90.ray + 0x348) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x348);
                      *(uint *)(local_b90.ray + 0x34c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x34c);
                      *(uint *)(local_b90.ray + 0x350) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x350);
                      *(uint *)(local_b90.ray + 0x354) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x354);
                      *(uint *)(local_b90.ray + 0x358) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x358);
                      *(uint *)(local_b90.ray + 0x35c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x35c);
                      *(uint *)(local_b90.ray + 0x360) =
                           (uint)(bVar75 & 1) * iVar63 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x360);
                      *(uint *)(local_b90.ray + 0x364) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x364);
                      *(uint *)(local_b90.ray + 0x368) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x368);
                      *(uint *)(local_b90.ray + 0x36c) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x36c);
                      *(uint *)(local_b90.ray + 0x370) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x370);
                      *(uint *)(local_b90.ray + 0x374) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x374);
                      *(uint *)(local_b90.ray + 0x378) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x378);
                      *(uint *)(local_b90.ray + 0x37c) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x37c);
                      iVar56 = *(int *)(local_b90.hit + 0x84);
                      iVar57 = *(int *)(local_b90.hit + 0x88);
                      iVar58 = *(int *)(local_b90.hit + 0x8c);
                      iVar59 = *(int *)(local_b90.hit + 0x90);
                      iVar60 = *(int *)(local_b90.hit + 0x94);
                      iVar61 = *(int *)(local_b90.hit + 0x98);
                      iVar62 = *(int *)(local_b90.hit + 0x9c);
                      iVar63 = *(int *)(local_b90.hit + 0xa0);
                      iVar64 = *(int *)(local_b90.hit + 0xa4);
                      iVar65 = *(int *)(local_b90.hit + 0xa8);
                      iVar66 = *(int *)(local_b90.hit + 0xac);
                      iVar67 = *(int *)(local_b90.hit + 0xb0);
                      iVar68 = *(int *)(local_b90.hit + 0xb4);
                      iVar69 = *(int *)(local_b90.hit + 0xb8);
                      iVar70 = *(int *)(local_b90.hit + 0xbc);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x380) =
                           (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0x80) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x380);
                      *(uint *)(local_b90.ray + 900) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 900);
                      *(uint *)(local_b90.ray + 0x388) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x388);
                      *(uint *)(local_b90.ray + 0x38c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x38c);
                      *(uint *)(local_b90.ray + 0x390) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x390);
                      *(uint *)(local_b90.ray + 0x394) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x394);
                      *(uint *)(local_b90.ray + 0x398) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x398);
                      *(uint *)(local_b90.ray + 0x39c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x39c);
                      *(uint *)(local_b90.ray + 0x3a0) =
                           (uint)(bVar75 & 1) * iVar63 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x3a0);
                      *(uint *)(local_b90.ray + 0x3a4) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x3a4);
                      *(uint *)(local_b90.ray + 0x3a8) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x3a8);
                      *(uint *)(local_b90.ray + 0x3ac) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x3ac);
                      *(uint *)(local_b90.ray + 0x3b0) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3b0);
                      *(uint *)(local_b90.ray + 0x3b4) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x3b4);
                      *(uint *)(local_b90.ray + 0x3b8) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3b8);
                      *(uint *)(local_b90.ray + 0x3bc) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3bc);
                      iVar56 = *(int *)(local_b90.hit + 0xc4);
                      iVar57 = *(int *)(local_b90.hit + 200);
                      iVar58 = *(int *)(local_b90.hit + 0xcc);
                      iVar59 = *(int *)(local_b90.hit + 0xd0);
                      iVar60 = *(int *)(local_b90.hit + 0xd4);
                      iVar61 = *(int *)(local_b90.hit + 0xd8);
                      iVar62 = *(int *)(local_b90.hit + 0xdc);
                      iVar63 = *(int *)(local_b90.hit + 0xe0);
                      iVar64 = *(int *)(local_b90.hit + 0xe4);
                      iVar65 = *(int *)(local_b90.hit + 0xe8);
                      iVar66 = *(int *)(local_b90.hit + 0xec);
                      iVar67 = *(int *)(local_b90.hit + 0xf0);
                      iVar68 = *(int *)(local_b90.hit + 0xf4);
                      iVar69 = *(int *)(local_b90.hit + 0xf8);
                      iVar70 = *(int *)(local_b90.hit + 0xfc);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x3c0) =
                           (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0xc0) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x3c0);
                      *(uint *)(local_b90.ray + 0x3c4) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x3c4);
                      *(uint *)(local_b90.ray + 0x3c8) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x3c8);
                      *(uint *)(local_b90.ray + 0x3cc) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x3cc);
                      *(uint *)(local_b90.ray + 0x3d0) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x3d0);
                      *(uint *)(local_b90.ray + 0x3d4) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x3d4);
                      *(uint *)(local_b90.ray + 0x3d8) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x3d8);
                      *(uint *)(local_b90.ray + 0x3dc) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x3dc);
                      *(uint *)(local_b90.ray + 0x3e0) =
                           (uint)(bVar75 & 1) * iVar63 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x3e0);
                      *(uint *)(local_b90.ray + 0x3e4) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x3e4);
                      *(uint *)(local_b90.ray + 1000) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 1000);
                      *(uint *)(local_b90.ray + 0x3ec) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x3ec);
                      *(uint *)(local_b90.ray + 0x3f0) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3f0);
                      *(uint *)(local_b90.ray + 0x3f4) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x3f4);
                      *(uint *)(local_b90.ray + 0x3f8) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3f8);
                      *(uint *)(local_b90.ray + 0x3fc) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3fc);
                      iVar56 = *(int *)(local_b90.hit + 0x104);
                      iVar57 = *(int *)(local_b90.hit + 0x108);
                      iVar58 = *(int *)(local_b90.hit + 0x10c);
                      iVar59 = *(int *)(local_b90.hit + 0x110);
                      iVar60 = *(int *)(local_b90.hit + 0x114);
                      iVar61 = *(int *)(local_b90.hit + 0x118);
                      iVar62 = *(int *)(local_b90.hit + 0x11c);
                      iVar63 = *(int *)(local_b90.hit + 0x120);
                      iVar64 = *(int *)(local_b90.hit + 0x124);
                      iVar65 = *(int *)(local_b90.hit + 0x128);
                      iVar66 = *(int *)(local_b90.hit + 300);
                      iVar67 = *(int *)(local_b90.hit + 0x130);
                      iVar68 = *(int *)(local_b90.hit + 0x134);
                      iVar69 = *(int *)(local_b90.hit + 0x138);
                      iVar70 = *(int *)(local_b90.hit + 0x13c);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x400) =
                           (uint)(bVar76 & 1) * *(int *)(local_b90.hit + 0x100) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x400);
                      *(uint *)(local_b90.ray + 0x404) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x404);
                      *(uint *)(local_b90.ray + 0x408) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x408);
                      *(uint *)(local_b90.ray + 0x40c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x40c);
                      *(uint *)(local_b90.ray + 0x410) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x410);
                      *(uint *)(local_b90.ray + 0x414) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x414);
                      *(uint *)(local_b90.ray + 0x418) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x418);
                      *(uint *)(local_b90.ray + 0x41c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x41c);
                      *(uint *)(local_b90.ray + 0x420) =
                           (uint)(bVar75 & 1) * iVar63 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_b90.ray + 0x420);
                      *(uint *)(local_b90.ray + 0x424) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x424);
                      *(uint *)(local_b90.ray + 0x428) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x428);
                      *(uint *)(local_b90.ray + 0x42c) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x42c);
                      *(uint *)(local_b90.ray + 0x430) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x430);
                      *(uint *)(local_b90.ray + 0x434) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x434);
                      *(uint *)(local_b90.ray + 0x438) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x438);
                      *(uint *)(local_b90.ray + 0x43c) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x43c);
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x140));
                      auVar177 = vmovdqu32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar177;
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x180));
                      auVar177 = vmovdqu32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar177;
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x1c0));
                      auVar177 = vmovdqa32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar177;
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x200));
                      auVar177 = vmovdqa32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar177;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar236;
                  break;
                }
              }
              lVar83 = lVar83 + -1;
            } while (lVar83 != 0);
            uVar179 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar175._4_4_ = uVar179;
            auVar175._0_4_ = uVar179;
            auVar175._8_4_ = uVar179;
            auVar175._12_4_ = uVar179;
            auVar175._16_4_ = uVar179;
            auVar175._20_4_ = uVar179;
            auVar175._24_4_ = uVar179;
            auVar175._28_4_ = uVar179;
            auVar71._4_4_ = fStack_73c;
            auVar71._0_4_ = local_740;
            auVar71._8_4_ = fStack_738;
            auVar71._12_4_ = fStack_734;
            auVar71._16_4_ = fStack_730;
            auVar71._20_4_ = fStack_72c;
            auVar71._24_4_ = fStack_728;
            auVar71._28_4_ = fStack_724;
            uVar21 = vcmpps_avx512vl(auVar175,auVar71,0xd);
            bVar84 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar84 & (byte)uVar21;
          } while (bVar84 != 0);
          auVar106 = local_6a0;
        }
        bVar77 = local_760[0] | ~bVar77;
        auVar199._0_4_ = (float)local_a00._0_4_ + auVar106._0_4_;
        auVar199._4_4_ = (float)local_a00._4_4_ + auVar106._4_4_;
        auVar199._8_4_ = fStack_9f8 + auVar106._8_4_;
        auVar199._12_4_ = fStack_9f4 + auVar106._12_4_;
        auVar199._16_4_ = fStack_9f0 + auVar106._16_4_;
        auVar199._20_4_ = fStack_9ec + auVar106._20_4_;
        auVar199._24_4_ = fStack_9e8 + auVar106._24_4_;
        auVar199._28_4_ = fStack_9e4 + auVar106._28_4_;
        uVar21 = vcmpps_avx512vl(auVar199,auVar175,2);
        bVar74 = (byte)uVar22 & bVar74 & (byte)uVar21;
        auVar200._8_4_ = 2;
        auVar200._0_8_ = 0x200000002;
        auVar200._12_4_ = 2;
        auVar200._16_4_ = 2;
        auVar200._20_4_ = 2;
        auVar200._24_4_ = 2;
        auVar200._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar200,auVar38);
        auVar146._0_4_ = (uint)(bVar77 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
        bVar6 = (bool)(bVar77 >> 1 & 1);
        auVar146._4_4_ = (uint)bVar6 * auVar106._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar77 >> 2 & 1);
        auVar146._8_4_ = (uint)bVar6 * auVar106._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar77 >> 3 & 1);
        auVar146._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar77 >> 4 & 1);
        auVar146._16_4_ = (uint)bVar6 * auVar106._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar77 >> 5 & 1);
        auVar146._20_4_ = (uint)bVar6 * auVar106._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar77 >> 6 & 1);
        auVar146._24_4_ = (uint)bVar6 * auVar106._24_4_ | (uint)!bVar6 * 2;
        auVar146._28_4_ = (uint)(bVar77 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
        uVar21 = vpcmpd_avx512vl(local_700,auVar146,5);
        bVar77 = (byte)uVar21 & bVar74;
        fVar218 = (float)local_a00._0_4_;
        fVar235 = (float)local_a00._4_4_;
        fVar236 = fStack_9f8;
        fVar237 = fStack_9f4;
        fVar238 = fStack_9f0;
        fVar159 = fStack_9ec;
        fVar239 = fStack_9e8;
        fVar240 = fStack_9e4;
        if (bVar77 != 0) {
          auVar95 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar93 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar20 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar94 = vminps_avx(auVar95,auVar20);
          auVar95 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar20 = vmaxps_avx(auVar93,auVar95);
          auVar209._8_4_ = 0x7fffffff;
          auVar209._0_8_ = 0x7fffffff7fffffff;
          auVar209._12_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar94,auVar209);
          auVar95 = vandps_avx(auVar20,auVar209);
          auVar93 = vmaxps_avx(auVar93,auVar95);
          auVar95 = vmovshdup_avx(auVar93);
          auVar95 = vmaxss_avx(auVar95,auVar93);
          auVar93 = vshufpd_avx(auVar93,auVar93,1);
          auVar93 = vmaxss_avx(auVar93,auVar95);
          fVar218 = auVar93._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar20,auVar20,0xff);
          local_740 = (float)local_a00._0_4_ + local_6e0._0_4_;
          fStack_73c = (float)local_a00._4_4_ + local_6e0._4_4_;
          fStack_738 = fStack_9f8 + local_6e0._8_4_;
          fStack_734 = fStack_9f4 + local_6e0._12_4_;
          fStack_730 = fStack_9f0 + local_6e0._16_4_;
          fStack_72c = fStack_9ec + local_6e0._20_4_;
          fStack_728 = fStack_9e8 + local_6e0._24_4_;
          fStack_724 = fStack_9e4 + local_6e0._28_4_;
          _local_900 = local_6e0;
          local_760 = auVar146;
          do {
            auVar176._8_4_ = 0x7f800000;
            auVar176._0_8_ = 0x7f8000007f800000;
            auVar176._12_4_ = 0x7f800000;
            auVar176._16_4_ = 0x7f800000;
            auVar176._20_4_ = 0x7f800000;
            auVar176._24_4_ = 0x7f800000;
            auVar176._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar176,_local_900);
            auVar147._0_4_ =
                 (uint)(bVar77 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar77 >> 1 & 1);
            auVar147._4_4_ = (uint)bVar6 * auVar106._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar77 >> 2 & 1);
            auVar147._8_4_ = (uint)bVar6 * auVar106._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar77 >> 3 & 1);
            auVar147._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar77 >> 4 & 1);
            auVar147._16_4_ = (uint)bVar6 * auVar106._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar77 >> 5 & 1);
            auVar147._20_4_ = (uint)bVar6 * auVar106._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar147._24_4_ =
                 (uint)(bVar77 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar106 = vminps_avx(auVar147,auVar106);
            auVar107 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar107);
            auVar107 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar107);
            uVar21 = vcmpps_avx512vl(auVar147,auVar106,0);
            bVar76 = (byte)uVar21 & bVar77;
            bVar84 = bVar77;
            if (bVar76 != 0) {
              bVar84 = bVar76;
            }
            iVar24 = 0;
            for (uVar87 = (uint)bVar84; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            uVar87 = *(uint *)(local_500 + (uint)(iVar24 << 2));
            uVar86 = *(uint *)(local_6c0 + (uint)(iVar24 << 2));
            fVar235 = auVar92._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar235 = sqrtf((float)local_a20._0_4_);
            }
            auVar93 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar87),0x10);
            auVar177 = ZEXT1664(auVar93);
            lVar83 = 5;
            do {
              uVar179 = auVar177._0_4_;
              auVar165._4_4_ = uVar179;
              auVar165._0_4_ = uVar179;
              auVar165._8_4_ = uVar179;
              auVar165._12_4_ = uVar179;
              auVar93 = vfmadd132ps_fma(auVar165,ZEXT816(0) << 0x40,local_a10);
              auVar95 = vmovshdup_avx(auVar177._0_16_);
              fVar241 = auVar95._0_4_;
              fVar240 = 1.0 - fVar241;
              fVar236 = fVar241 * fVar241;
              auVar97 = SUB6416(ZEXT464(0x40400000),0);
              auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar94 = vfmadd213ss_fma(auVar97,auVar95,auVar96);
              auVar20 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar236),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar100 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar240),auVar96);
              auVar100 = vfmadd213ss_fma(auVar100,ZEXT416((uint)(fVar240 * fVar240)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar237 = fVar240 * fVar240 * -fVar241 * 0.5;
              fVar238 = auVar20._0_4_ * 0.5;
              fVar159 = auVar100._0_4_ * 0.5;
              fVar239 = fVar241 * fVar241 * -fVar240 * 0.5;
              auVar228._0_4_ = fVar239 * (float)local_9e0._0_4_;
              auVar228._4_4_ = fVar239 * (float)local_9e0._4_4_;
              auVar228._8_4_ = fVar239 * fStack_9d8;
              auVar228._12_4_ = fVar239 * fStack_9d4;
              auVar245._4_4_ = fVar159;
              auVar245._0_4_ = fVar159;
              auVar245._8_4_ = fVar159;
              auVar245._12_4_ = fVar159;
              auVar20 = vfmadd132ps_fma(auVar245,auVar228,local_9a0._0_16_);
              auVar210._4_4_ = fVar238;
              auVar210._0_4_ = fVar238;
              auVar210._8_4_ = fVar238;
              auVar210._12_4_ = fVar238;
              auVar20 = vfmadd132ps_fma(auVar210,auVar20,local_9c0._0_16_);
              auVar229._4_4_ = fVar237;
              auVar229._0_4_ = fVar237;
              auVar229._8_4_ = fVar237;
              auVar229._12_4_ = fVar237;
              auVar20 = vfmadd132ps_fma(auVar229,auVar20,local_980._0_16_);
              auVar100 = vfmadd231ss_fma(auVar96,auVar95,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar100;
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar95,ZEXT416(0x40800000))
              ;
              local_8c0._0_16_ = auVar100;
              auVar100 = vfmadd213ss_fma(auVar97,auVar95,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar100;
              _local_880 = auVar20;
              auVar20 = vsubps_avx(auVar93,auVar20);
              auVar93 = vdpps_avx(auVar20,auVar20,0x7f);
              fVar237 = auVar93._0_4_;
              local_800 = auVar177;
              if (fVar237 < 0.0) {
                local_aa0._0_4_ = auVar94._0_4_;
                local_ac0._0_16_ = ZEXT416((uint)fVar240);
                local_a40._0_4_ = fVar236;
                local_a60._0_4_ = fVar240 * -2.0;
                auVar269._0_4_ = sqrtf(fVar237);
                auVar269._4_60_ = extraout_var_00;
                auVar94 = ZEXT416((uint)local_aa0._0_4_);
                auVar100 = auVar269._0_16_;
                auVar96 = local_ac0._0_16_;
              }
              else {
                auVar100 = vsqrtss_avx(auVar93,auVar93);
                local_a60._0_4_ = fVar240 * -2.0;
                local_a40._0_4_ = fVar236;
                auVar96 = ZEXT416((uint)fVar240);
              }
              fVar236 = auVar96._0_4_;
              auVar98 = vfnmadd231ss_fma(ZEXT416((uint)(fVar241 * (fVar236 + fVar236))),auVar96,
                                         auVar96);
              auVar94 = vfmadd213ss_fma(auVar94,ZEXT416((uint)(fVar241 + fVar241)),
                                        ZEXT416((uint)(fVar241 * fVar241 * 3.0)));
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar95,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar236 * -3.0)),
                                        ZEXT416((uint)(fVar236 + fVar236)),auVar96);
              auVar96 = vfmadd213ss_fma(ZEXT416((uint)local_a60._0_4_),auVar95,
                                        ZEXT416((uint)local_a40._0_4_));
              fVar236 = auVar98._0_4_ * 0.5;
              fVar238 = auVar94._0_4_ * 0.5;
              fVar159 = auVar97._0_4_ * 0.5;
              fVar239 = auVar96._0_4_ * 0.5;
              auVar230._0_4_ = fVar239 * (float)local_9e0._0_4_;
              auVar230._4_4_ = fVar239 * (float)local_9e0._4_4_;
              auVar230._8_4_ = fVar239 * fStack_9d8;
              auVar230._12_4_ = fVar239 * fStack_9d4;
              auVar211._4_4_ = fVar159;
              auVar211._0_4_ = fVar159;
              auVar211._8_4_ = fVar159;
              auVar211._12_4_ = fVar159;
              auVar94 = vfmadd132ps_fma(auVar211,auVar230,local_9a0._0_16_);
              auVar190._4_4_ = fVar238;
              auVar190._0_4_ = fVar238;
              auVar190._8_4_ = fVar238;
              auVar190._12_4_ = fVar238;
              auVar94 = vfmadd132ps_fma(auVar190,auVar94,local_9c0._0_16_);
              auVar278._4_4_ = fVar236;
              auVar278._0_4_ = fVar236;
              auVar278._8_4_ = fVar236;
              auVar278._12_4_ = fVar236;
              local_aa0._0_16_ = vfmadd132ps_fma(auVar278,auVar94,local_980._0_16_);
              local_a40._0_16_ = vdpps_avx(local_aa0._0_16_,local_aa0._0_16_,0x7f);
              auVar54._12_4_ = 0;
              auVar54._0_12_ = ZEXT812(0);
              fVar236 = local_a40._0_4_;
              auVar94 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar236));
              fVar238 = auVar94._0_4_;
              local_a60._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar236));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar96 = vxorps_avx512vl(local_a40._0_16_,auVar30);
              auVar94 = vfnmadd213ss_fma(local_a60._0_16_,local_a40._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_a80._0_4_ = auVar94._0_4_;
              local_ac0._0_4_ = auVar100._0_4_;
              if (fVar236 < auVar96._0_4_) {
                fVar159 = sqrtf(fVar236);
                auVar100 = ZEXT416((uint)local_ac0._0_4_);
                auVar94 = local_aa0._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                fVar159 = auVar94._0_4_;
                auVar94 = local_aa0._0_16_;
              }
              fVar236 = fVar238 * 1.5 + fVar236 * -0.5 * fVar238 * fVar238 * fVar238;
              auVar166._0_4_ = auVar94._0_4_ * fVar236;
              auVar166._4_4_ = auVar94._4_4_ * fVar236;
              auVar166._8_4_ = auVar94._8_4_ * fVar236;
              auVar166._12_4_ = auVar94._12_4_ * fVar236;
              auVar96 = vdpps_avx(auVar20,auVar166,0x7f);
              fVar240 = auVar100._0_4_;
              fVar238 = auVar96._0_4_;
              auVar167._0_4_ = fVar238 * fVar238;
              auVar167._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar167._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar167._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar97 = vsubps_avx512vl(auVar93,auVar167);
              fVar239 = auVar97._0_4_;
              auVar191._4_12_ = ZEXT812(0) << 0x20;
              auVar191._0_4_ = fVar239;
              auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              auVar91 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
              if (fVar239 < 0.0) {
                local_930 = fVar236;
                fStack_92c = fVar236;
                fStack_928 = fVar236;
                fStack_924 = fVar236;
                local_920 = auVar98;
                fVar239 = sqrtf(fVar239);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar100 = ZEXT416((uint)local_ac0._0_4_);
                auVar97 = local_920;
                auVar94 = local_aa0._0_16_;
                fVar236 = local_930;
                fVar241 = fStack_92c;
                fVar247 = fStack_928;
                fVar248 = fStack_924;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
                fVar239 = auVar97._0_4_;
                auVar97 = auVar98;
                fVar241 = fVar236;
                fVar247 = fVar236;
                fVar248 = fVar236;
              }
              auVar273 = ZEXT1664(auVar20);
              auVar285 = ZEXT3264(local_ae0);
              auVar286 = ZEXT3264(local_b00);
              auVar287 = ZEXT3264(local_b20);
              auVar288 = ZEXT3264(local_b40);
              auVar289 = ZEXT3264(local_b60);
              auVar192._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar192._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar192._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar192._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar212._4_4_ = local_8c0._0_4_;
              auVar212._0_4_ = local_8c0._0_4_;
              auVar212._8_4_ = local_8c0._0_4_;
              auVar212._12_4_ = local_8c0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar212,auVar192,local_9a0._0_16_);
              auVar193._4_4_ = local_8a0._0_4_;
              auVar193._0_4_ = local_8a0._0_4_;
              auVar193._8_4_ = local_8a0._0_4_;
              auVar193._12_4_ = local_8a0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar193,auVar89,local_9c0._0_16_);
              auVar95 = vfmadd213ss_fma(auVar95,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar179 = auVar95._0_4_;
              auVar213._4_4_ = uVar179;
              auVar213._0_4_ = uVar179;
              auVar213._8_4_ = uVar179;
              auVar213._12_4_ = uVar179;
              auVar95 = vfmadd132ps_fma(auVar213,auVar89,local_980._0_16_);
              auVar194._0_4_ = auVar95._0_4_ * (float)local_a40._0_4_;
              auVar194._4_4_ = auVar95._4_4_ * (float)local_a40._0_4_;
              auVar194._8_4_ = auVar95._8_4_ * (float)local_a40._0_4_;
              auVar194._12_4_ = auVar95._12_4_ * (float)local_a40._0_4_;
              auVar95 = vdpps_avx(auVar94,auVar95,0x7f);
              fVar249 = auVar95._0_4_;
              auVar214._0_4_ = auVar94._0_4_ * fVar249;
              auVar214._4_4_ = auVar94._4_4_ * fVar249;
              auVar214._8_4_ = auVar94._8_4_ * fVar249;
              auVar214._12_4_ = auVar94._12_4_ * fVar249;
              auVar95 = vsubps_avx(auVar194,auVar214);
              fVar249 = (float)local_a80._0_4_ * (float)local_a60._0_4_;
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar218),
                                   ZEXT416((uint)(local_800._0_4_ * fVar235 * 1.9073486e-06)));
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar150._16_48_ = local_800._16_48_;
              auVar99 = vxorps_avx512vl(auVar94,auVar31);
              auVar195._0_4_ = fVar236 * auVar95._0_4_ * fVar249;
              auVar195._4_4_ = fVar241 * auVar95._4_4_ * fVar249;
              auVar195._8_4_ = fVar247 * auVar95._8_4_ * fVar249;
              auVar195._12_4_ = fVar248 * auVar95._12_4_ * fVar249;
              auVar275 = ZEXT1664(auVar166);
              auVar95 = vdpps_avx(auVar99,auVar166,0x7f);
              auVar88 = vfmadd213ss_fma(auVar100,ZEXT416((uint)fVar218),auVar89);
              auVar100 = vdpps_avx(auVar20,auVar195,0x7f);
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 + 1.0)),
                                        ZEXT416((uint)(fVar218 / fVar159)),auVar88);
              fVar236 = auVar95._0_4_ + auVar100._0_4_;
              auVar95 = vdpps_avx(local_a10,auVar166,0x7f);
              auVar100 = vdpps_avx(auVar20,auVar99,0x7f);
              auVar91 = vmulss_avx512f(auVar91,auVar97);
              fVar159 = auVar98._0_4_ * 1.5 + auVar91._0_4_ * auVar97._0_4_ * auVar97._0_4_;
              auVar97 = vdpps_avx(auVar20,local_a10,0x7f);
              auVar91 = vfnmadd231ss_fma(auVar100,auVar96,ZEXT416((uint)fVar236));
              auVar97 = vfnmadd231ss_fma(auVar97,auVar96,auVar95);
              auVar100 = vpermilps_avx(_local_880,0xff);
              fVar239 = fVar239 - auVar100._0_4_;
              auVar98 = vshufps_avx(auVar94,auVar94,0xff);
              auVar100 = vfmsub213ss_fma(auVar91,ZEXT416((uint)fVar159),auVar98);
              auVar268._8_4_ = 0x80000000;
              auVar268._0_8_ = 0x8000000080000000;
              auVar268._12_4_ = 0x80000000;
              auVar269 = ZEXT1664(auVar268);
              auVar263._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
              auVar263._8_4_ = auVar100._8_4_ ^ 0x80000000;
              auVar263._12_4_ = auVar100._12_4_ ^ 0x80000000;
              auVar265 = ZEXT1664(auVar263);
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * fVar159));
              auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar100._0_4_)),
                                        ZEXT416((uint)fVar236),auVar97);
              auVar100 = vinsertps_avx(auVar263,auVar97,0x1c);
              auVar254._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar95._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar95._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar236),auVar254,0x10);
              auVar231._0_4_ = auVar91._0_4_;
              auVar231._4_4_ = auVar231._0_4_;
              auVar231._8_4_ = auVar231._0_4_;
              auVar231._12_4_ = auVar231._0_4_;
              auVar95 = vdivps_avx(auVar100,auVar231);
              auVar100 = vdivps_avx(auVar97,auVar231);
              auVar232._0_4_ = fVar238 * auVar95._0_4_ + fVar239 * auVar100._0_4_;
              auVar232._4_4_ = fVar238 * auVar95._4_4_ + fVar239 * auVar100._4_4_;
              auVar232._8_4_ = fVar238 * auVar95._8_4_ + fVar239 * auVar100._8_4_;
              auVar232._12_4_ = fVar238 * auVar95._12_4_ + fVar239 * auVar100._12_4_;
              auVar95 = vsubps_avx(local_800._0_16_,auVar232);
              auVar177 = ZEXT1664(auVar95);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar100 = vandps_avx512vl(auVar96,auVar32);
              if (auVar100._0_4_ < auVar88._0_4_) {
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar89._0_4_)),local_940,
                                           ZEXT416(0x36000000));
                auVar33._8_4_ = 0x7fffffff;
                auVar33._0_8_ = 0x7fffffff7fffffff;
                auVar33._12_4_ = 0x7fffffff;
                auVar96 = vandps_avx512vl(ZEXT416((uint)fVar239),auVar33);
                if (auVar96._0_4_ < auVar100._0_4_) {
                  fVar235 = auVar95._0_4_ + (float)local_950._0_4_;
                  if ((fVar235 < fVar178) ||
                     (fVar236 = *(float *)(ray + k * 4 + 0x200), fVar236 < fVar235)) break;
                  auVar95 = vmovshdup_avx(auVar95);
                  fVar238 = auVar95._0_4_;
                  if ((fVar238 < 0.0) || (1.0 < fVar238)) break;
                  auVar55._12_4_ = 0;
                  auVar55._0_12_ = ZEXT412(0);
                  auVar150._4_12_ = ZEXT412(0);
                  auVar150._0_4_ = fVar237;
                  auVar95 = vrsqrt14ss_avx512f(auVar55 << 0x20,auVar150._0_16_);
                  fVar237 = auVar95._0_4_;
                  auVar93 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar237 = fVar237 * 1.5 + auVar93._0_4_ * fVar237 * fVar237 * fVar237;
                  auVar233._0_4_ = auVar20._0_4_ * fVar237;
                  auVar233._4_4_ = auVar20._4_4_ * fVar237;
                  auVar233._8_4_ = auVar20._8_4_ * fVar237;
                  auVar233._12_4_ = auVar20._12_4_ * fVar237;
                  auVar100 = vfmadd213ps_fma(auVar98,auVar233,auVar94);
                  auVar93 = vshufps_avx(auVar233,auVar233,0xc9);
                  auVar95 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar234._0_4_ = auVar233._0_4_ * auVar95._0_4_;
                  auVar234._4_4_ = auVar233._4_4_ * auVar95._4_4_;
                  auVar234._8_4_ = auVar233._8_4_ * auVar95._8_4_;
                  auVar234._12_4_ = auVar233._12_4_ * auVar95._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar234,auVar94,auVar93);
                  auVar93 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar95 = vshufps_avx(auVar100,auVar100,0xc9);
                  auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                  auVar196._0_4_ = auVar100._0_4_ * auVar94._0_4_;
                  auVar196._4_4_ = auVar100._4_4_ * auVar94._4_4_;
                  auVar196._8_4_ = auVar100._8_4_ * auVar94._8_4_;
                  auVar196._12_4_ = auVar100._12_4_ * auVar94._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar196,auVar93,auVar95);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar235;
                    uVar179 = vextractps_avx(auVar93,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar179;
                    uVar179 = vextractps_avx(auVar93,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar179;
                    *(int *)(ray + k * 4 + 0x380) = auVar93._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar238;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar2;
                    *(uint *)(ray + k * 4 + 0x480) = uVar82;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar5 = context->user;
                  auVar151 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar151,auVar177);
                  auVar177 = vpermps_avx512f(auVar151,ZEXT1664(auVar93));
                  auVar151 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar151,ZEXT1664(auVar93));
                  local_380 = vbroadcastss_avx512f(auVar93);
                  local_400[0] = (RTCHitN)auVar177[0];
                  local_400[1] = (RTCHitN)auVar177[1];
                  local_400[2] = (RTCHitN)auVar177[2];
                  local_400[3] = (RTCHitN)auVar177[3];
                  local_400[4] = (RTCHitN)auVar177[4];
                  local_400[5] = (RTCHitN)auVar177[5];
                  local_400[6] = (RTCHitN)auVar177[6];
                  local_400[7] = (RTCHitN)auVar177[7];
                  local_400[8] = (RTCHitN)auVar177[8];
                  local_400[9] = (RTCHitN)auVar177[9];
                  local_400[10] = (RTCHitN)auVar177[10];
                  local_400[0xb] = (RTCHitN)auVar177[0xb];
                  local_400[0xc] = (RTCHitN)auVar177[0xc];
                  local_400[0xd] = (RTCHitN)auVar177[0xd];
                  local_400[0xe] = (RTCHitN)auVar177[0xe];
                  local_400[0xf] = (RTCHitN)auVar177[0xf];
                  local_400[0x10] = (RTCHitN)auVar177[0x10];
                  local_400[0x11] = (RTCHitN)auVar177[0x11];
                  local_400[0x12] = (RTCHitN)auVar177[0x12];
                  local_400[0x13] = (RTCHitN)auVar177[0x13];
                  local_400[0x14] = (RTCHitN)auVar177[0x14];
                  local_400[0x15] = (RTCHitN)auVar177[0x15];
                  local_400[0x16] = (RTCHitN)auVar177[0x16];
                  local_400[0x17] = (RTCHitN)auVar177[0x17];
                  local_400[0x18] = (RTCHitN)auVar177[0x18];
                  local_400[0x19] = (RTCHitN)auVar177[0x19];
                  local_400[0x1a] = (RTCHitN)auVar177[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar177[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar177[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar177[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar177[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar177[0x1f];
                  local_400[0x20] = (RTCHitN)auVar177[0x20];
                  local_400[0x21] = (RTCHitN)auVar177[0x21];
                  local_400[0x22] = (RTCHitN)auVar177[0x22];
                  local_400[0x23] = (RTCHitN)auVar177[0x23];
                  local_400[0x24] = (RTCHitN)auVar177[0x24];
                  local_400[0x25] = (RTCHitN)auVar177[0x25];
                  local_400[0x26] = (RTCHitN)auVar177[0x26];
                  local_400[0x27] = (RTCHitN)auVar177[0x27];
                  local_400[0x28] = (RTCHitN)auVar177[0x28];
                  local_400[0x29] = (RTCHitN)auVar177[0x29];
                  local_400[0x2a] = (RTCHitN)auVar177[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar177[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar177[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar177[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar177[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar177[0x2f];
                  local_400[0x30] = (RTCHitN)auVar177[0x30];
                  local_400[0x31] = (RTCHitN)auVar177[0x31];
                  local_400[0x32] = (RTCHitN)auVar177[0x32];
                  local_400[0x33] = (RTCHitN)auVar177[0x33];
                  local_400[0x34] = (RTCHitN)auVar177[0x34];
                  local_400[0x35] = (RTCHitN)auVar177[0x35];
                  local_400[0x36] = (RTCHitN)auVar177[0x36];
                  local_400[0x37] = (RTCHitN)auVar177[0x37];
                  local_400[0x38] = (RTCHitN)auVar177[0x38];
                  local_400[0x39] = (RTCHitN)auVar177[0x39];
                  local_400[0x3a] = (RTCHitN)auVar177[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar177[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar177[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar177[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar177[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar177[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar177 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar177);
                  auVar106 = vpcmpeqd_avx2(auVar177._0_32_,auVar177._0_32_);
                  local_a68[3] = auVar106;
                  local_a68[2] = auVar106;
                  local_a68[1] = auVar106;
                  *local_a68 = auVar106;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar235;
                  auVar177 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar177);
                  local_b90.valid = (int *)local_7c0;
                  local_b90.geometryUserPtr = pGVar3->userPtr;
                  local_b90.context = context->user;
                  local_b90.hit = local_400;
                  local_b90.N = 0x10;
                  local_b90.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar265 = ZEXT1664(auVar263);
                    auVar269 = ZEXT1664(auVar268);
                    auVar273 = ZEXT1664(auVar20);
                    auVar275 = ZEXT1664(auVar166);
                    (*pGVar3->intersectionFilterN)(&local_b90);
                    auVar289 = ZEXT3264(local_b60);
                    auVar288 = ZEXT3264(local_b40);
                    auVar287 = ZEXT3264(local_b20);
                    auVar286 = ZEXT3264(local_b00);
                    auVar285 = ZEXT3264(local_ae0);
                    auVar177 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar21 = vptestmd_avx512f(auVar177,auVar177);
                  if ((short)uVar21 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      (*p_Var4)(&local_b90);
                      auVar289 = ZEXT3264(local_b60);
                      auVar288 = ZEXT3264(local_b40);
                      auVar287 = ZEXT3264(local_b20);
                      auVar286 = ZEXT3264(local_b00);
                      auVar285 = ZEXT3264(local_ae0);
                      auVar177 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar85 = vptestmd_avx512f(auVar177,auVar177);
                    if ((short)uVar85 != 0) {
                      iVar56 = *(int *)(local_b90.hit + 4);
                      iVar57 = *(int *)(local_b90.hit + 8);
                      iVar58 = *(int *)(local_b90.hit + 0xc);
                      iVar59 = *(int *)(local_b90.hit + 0x10);
                      iVar60 = *(int *)(local_b90.hit + 0x14);
                      iVar61 = *(int *)(local_b90.hit + 0x18);
                      iVar62 = *(int *)(local_b90.hit + 0x1c);
                      iVar63 = *(int *)(local_b90.hit + 0x20);
                      iVar64 = *(int *)(local_b90.hit + 0x24);
                      iVar65 = *(int *)(local_b90.hit + 0x28);
                      iVar66 = *(int *)(local_b90.hit + 0x2c);
                      iVar67 = *(int *)(local_b90.hit + 0x30);
                      iVar68 = *(int *)(local_b90.hit + 0x34);
                      iVar69 = *(int *)(local_b90.hit + 0x38);
                      iVar70 = *(int *)(local_b90.hit + 0x3c);
                      bVar84 = (byte)uVar85;
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar76 = (byte)(uVar85 >> 8);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x300) =
                           (uint)(bVar84 & 1) * *(int *)local_b90.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b90.ray + 0x300);
                      *(uint *)(local_b90.ray + 0x304) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x304);
                      *(uint *)(local_b90.ray + 0x308) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x308);
                      *(uint *)(local_b90.ray + 0x30c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x30c);
                      *(uint *)(local_b90.ray + 0x310) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x310);
                      *(uint *)(local_b90.ray + 0x314) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x314);
                      *(uint *)(local_b90.ray + 0x318) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x318);
                      *(uint *)(local_b90.ray + 0x31c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x31c);
                      *(uint *)(local_b90.ray + 800) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 800);
                      *(uint *)(local_b90.ray + 0x324) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x324);
                      *(uint *)(local_b90.ray + 0x328) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x328);
                      *(uint *)(local_b90.ray + 0x32c) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x32c);
                      *(uint *)(local_b90.ray + 0x330) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x330);
                      *(uint *)(local_b90.ray + 0x334) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x334);
                      *(uint *)(local_b90.ray + 0x338) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x338);
                      *(uint *)(local_b90.ray + 0x33c) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x33c);
                      iVar56 = *(int *)(local_b90.hit + 0x44);
                      iVar57 = *(int *)(local_b90.hit + 0x48);
                      iVar58 = *(int *)(local_b90.hit + 0x4c);
                      iVar59 = *(int *)(local_b90.hit + 0x50);
                      iVar60 = *(int *)(local_b90.hit + 0x54);
                      iVar61 = *(int *)(local_b90.hit + 0x58);
                      iVar62 = *(int *)(local_b90.hit + 0x5c);
                      iVar63 = *(int *)(local_b90.hit + 0x60);
                      iVar64 = *(int *)(local_b90.hit + 100);
                      iVar65 = *(int *)(local_b90.hit + 0x68);
                      iVar66 = *(int *)(local_b90.hit + 0x6c);
                      iVar67 = *(int *)(local_b90.hit + 0x70);
                      iVar68 = *(int *)(local_b90.hit + 0x74);
                      iVar69 = *(int *)(local_b90.hit + 0x78);
                      iVar70 = *(int *)(local_b90.hit + 0x7c);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x340) =
                           (uint)(bVar84 & 1) * *(int *)(local_b90.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b90.ray + 0x340);
                      *(uint *)(local_b90.ray + 0x344) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x344);
                      *(uint *)(local_b90.ray + 0x348) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x348);
                      *(uint *)(local_b90.ray + 0x34c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x34c);
                      *(uint *)(local_b90.ray + 0x350) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x350);
                      *(uint *)(local_b90.ray + 0x354) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x354);
                      *(uint *)(local_b90.ray + 0x358) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x358);
                      *(uint *)(local_b90.ray + 0x35c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x35c);
                      *(uint *)(local_b90.ray + 0x360) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x360);
                      *(uint *)(local_b90.ray + 0x364) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x364);
                      *(uint *)(local_b90.ray + 0x368) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x368);
                      *(uint *)(local_b90.ray + 0x36c) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x36c);
                      *(uint *)(local_b90.ray + 0x370) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x370);
                      *(uint *)(local_b90.ray + 0x374) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x374);
                      *(uint *)(local_b90.ray + 0x378) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x378);
                      *(uint *)(local_b90.ray + 0x37c) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x37c);
                      iVar56 = *(int *)(local_b90.hit + 0x84);
                      iVar57 = *(int *)(local_b90.hit + 0x88);
                      iVar58 = *(int *)(local_b90.hit + 0x8c);
                      iVar59 = *(int *)(local_b90.hit + 0x90);
                      iVar60 = *(int *)(local_b90.hit + 0x94);
                      iVar61 = *(int *)(local_b90.hit + 0x98);
                      iVar62 = *(int *)(local_b90.hit + 0x9c);
                      iVar63 = *(int *)(local_b90.hit + 0xa0);
                      iVar64 = *(int *)(local_b90.hit + 0xa4);
                      iVar65 = *(int *)(local_b90.hit + 0xa8);
                      iVar66 = *(int *)(local_b90.hit + 0xac);
                      iVar67 = *(int *)(local_b90.hit + 0xb0);
                      iVar68 = *(int *)(local_b90.hit + 0xb4);
                      iVar69 = *(int *)(local_b90.hit + 0xb8);
                      iVar70 = *(int *)(local_b90.hit + 0xbc);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x380) =
                           (uint)(bVar84 & 1) * *(int *)(local_b90.hit + 0x80) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b90.ray + 0x380);
                      *(uint *)(local_b90.ray + 900) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 900);
                      *(uint *)(local_b90.ray + 0x388) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x388);
                      *(uint *)(local_b90.ray + 0x38c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x38c);
                      *(uint *)(local_b90.ray + 0x390) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x390);
                      *(uint *)(local_b90.ray + 0x394) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x394);
                      *(uint *)(local_b90.ray + 0x398) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x398);
                      *(uint *)(local_b90.ray + 0x39c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x39c);
                      *(uint *)(local_b90.ray + 0x3a0) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x3a0);
                      *(uint *)(local_b90.ray + 0x3a4) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x3a4);
                      *(uint *)(local_b90.ray + 0x3a8) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x3a8);
                      *(uint *)(local_b90.ray + 0x3ac) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x3ac);
                      *(uint *)(local_b90.ray + 0x3b0) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3b0);
                      *(uint *)(local_b90.ray + 0x3b4) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x3b4);
                      *(uint *)(local_b90.ray + 0x3b8) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3b8);
                      *(uint *)(local_b90.ray + 0x3bc) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3bc);
                      iVar56 = *(int *)(local_b90.hit + 0xc4);
                      iVar57 = *(int *)(local_b90.hit + 200);
                      iVar58 = *(int *)(local_b90.hit + 0xcc);
                      iVar59 = *(int *)(local_b90.hit + 0xd0);
                      iVar60 = *(int *)(local_b90.hit + 0xd4);
                      iVar61 = *(int *)(local_b90.hit + 0xd8);
                      iVar62 = *(int *)(local_b90.hit + 0xdc);
                      iVar63 = *(int *)(local_b90.hit + 0xe0);
                      iVar64 = *(int *)(local_b90.hit + 0xe4);
                      iVar65 = *(int *)(local_b90.hit + 0xe8);
                      iVar66 = *(int *)(local_b90.hit + 0xec);
                      iVar67 = *(int *)(local_b90.hit + 0xf0);
                      iVar68 = *(int *)(local_b90.hit + 0xf4);
                      iVar69 = *(int *)(local_b90.hit + 0xf8);
                      iVar70 = *(int *)(local_b90.hit + 0xfc);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x3c0) =
                           (uint)(bVar84 & 1) * *(int *)(local_b90.hit + 0xc0) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b90.ray + 0x3c0);
                      *(uint *)(local_b90.ray + 0x3c4) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x3c4);
                      *(uint *)(local_b90.ray + 0x3c8) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x3c8);
                      *(uint *)(local_b90.ray + 0x3cc) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x3cc);
                      *(uint *)(local_b90.ray + 0x3d0) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x3d0);
                      *(uint *)(local_b90.ray + 0x3d4) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x3d4);
                      *(uint *)(local_b90.ray + 0x3d8) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x3d8);
                      *(uint *)(local_b90.ray + 0x3dc) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x3dc);
                      *(uint *)(local_b90.ray + 0x3e0) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x3e0);
                      *(uint *)(local_b90.ray + 0x3e4) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x3e4);
                      *(uint *)(local_b90.ray + 1000) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 1000);
                      *(uint *)(local_b90.ray + 0x3ec) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x3ec);
                      *(uint *)(local_b90.ray + 0x3f0) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x3f0);
                      *(uint *)(local_b90.ray + 0x3f4) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x3f4);
                      *(uint *)(local_b90.ray + 0x3f8) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x3f8);
                      *(uint *)(local_b90.ray + 0x3fc) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x3fc);
                      iVar56 = *(int *)(local_b90.hit + 0x104);
                      iVar57 = *(int *)(local_b90.hit + 0x108);
                      iVar58 = *(int *)(local_b90.hit + 0x10c);
                      iVar59 = *(int *)(local_b90.hit + 0x110);
                      iVar60 = *(int *)(local_b90.hit + 0x114);
                      iVar61 = *(int *)(local_b90.hit + 0x118);
                      iVar62 = *(int *)(local_b90.hit + 0x11c);
                      iVar63 = *(int *)(local_b90.hit + 0x120);
                      iVar64 = *(int *)(local_b90.hit + 0x124);
                      iVar65 = *(int *)(local_b90.hit + 0x128);
                      iVar66 = *(int *)(local_b90.hit + 300);
                      iVar67 = *(int *)(local_b90.hit + 0x130);
                      iVar68 = *(int *)(local_b90.hit + 0x134);
                      iVar69 = *(int *)(local_b90.hit + 0x138);
                      iVar70 = *(int *)(local_b90.hit + 0x13c);
                      bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar19 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b90.ray + 0x400) =
                           (uint)(bVar84 & 1) * *(int *)(local_b90.hit + 0x100) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b90.ray + 0x400);
                      *(uint *)(local_b90.ray + 0x404) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_b90.ray + 0x404);
                      *(uint *)(local_b90.ray + 0x408) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_b90.ray + 0x408);
                      *(uint *)(local_b90.ray + 0x40c) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_b90.ray + 0x40c);
                      *(uint *)(local_b90.ray + 0x410) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_b90.ray + 0x410);
                      *(uint *)(local_b90.ray + 0x414) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_b90.ray + 0x414);
                      *(uint *)(local_b90.ray + 0x418) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_b90.ray + 0x418);
                      *(uint *)(local_b90.ray + 0x41c) =
                           (uint)bVar12 * iVar62 | (uint)!bVar12 * *(int *)(local_b90.ray + 0x41c);
                      *(uint *)(local_b90.ray + 0x420) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b90.ray + 0x420);
                      *(uint *)(local_b90.ray + 0x424) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_b90.ray + 0x424);
                      *(uint *)(local_b90.ray + 0x428) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_b90.ray + 0x428);
                      *(uint *)(local_b90.ray + 0x42c) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_b90.ray + 0x42c);
                      *(uint *)(local_b90.ray + 0x430) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_b90.ray + 0x430);
                      *(uint *)(local_b90.ray + 0x434) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_b90.ray + 0x434);
                      *(uint *)(local_b90.ray + 0x438) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_b90.ray + 0x438);
                      *(uint *)(local_b90.ray + 0x43c) =
                           (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_b90.ray + 0x43c);
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x140));
                      auVar177 = vmovdqu32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x440) = auVar177;
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x180));
                      auVar177 = vmovdqu32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x480) = auVar177;
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x1c0));
                      auVar177 = vmovdqa32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x4c0) = auVar177;
                      auVar177 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b90.hit + 0x200));
                      auVar177 = vmovdqa32_avx512f(auVar177);
                      *(undefined1 (*) [64])(local_b90.ray + 0x500) = auVar177;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar236;
                  break;
                }
              }
              lVar83 = lVar83 + -1;
            } while (lVar83 != 0);
            uVar179 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar175._4_4_ = uVar179;
            auVar175._0_4_ = uVar179;
            auVar175._8_4_ = uVar179;
            auVar175._12_4_ = uVar179;
            auVar175._16_4_ = uVar179;
            auVar175._20_4_ = uVar179;
            auVar175._24_4_ = uVar179;
            auVar175._28_4_ = uVar179;
            auVar72._4_4_ = fStack_73c;
            auVar72._0_4_ = local_740;
            auVar72._8_4_ = fStack_738;
            auVar72._12_4_ = fStack_734;
            auVar72._16_4_ = fStack_730;
            auVar72._20_4_ = fStack_72c;
            auVar72._24_4_ = fStack_728;
            auVar72._28_4_ = fStack_724;
            uVar21 = vcmpps_avx512vl(auVar175,auVar72,0xd);
            bVar77 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar77 & (byte)uVar21;
          } while (bVar77 != 0);
          auVar146 = local_760;
          fVar218 = (float)local_a00._0_4_;
          fVar235 = (float)local_a00._4_4_;
          fVar236 = fStack_9f8;
          fVar237 = fStack_9f4;
          fVar238 = fStack_9f0;
          fVar159 = fStack_9ec;
          fVar239 = fStack_9e8;
          fVar240 = fStack_9e4;
        }
        uVar22 = vpcmpgtd_avx512vl(auVar146,local_700);
        uVar23 = vpcmpd_avx512vl(local_700,local_680,1);
        auVar216._0_4_ = fVar218 + (float)local_540._0_4_;
        auVar216._4_4_ = fVar235 + (float)local_540._4_4_;
        auVar216._8_4_ = fVar236 + fStack_538;
        auVar216._12_4_ = fVar237 + fStack_534;
        auVar216._16_4_ = fVar238 + fStack_530;
        auVar216._20_4_ = fVar159 + fStack_52c;
        auVar216._24_4_ = fVar239 + fStack_528;
        auVar216._28_4_ = fVar240 + fStack_524;
        uVar21 = vcmpps_avx512vl(auVar216,auVar175,2);
        bVar78 = bVar78 & (byte)uVar23 & (byte)uVar21;
        auVar217._0_4_ = fVar218 + local_6e0._0_4_;
        auVar217._4_4_ = fVar235 + local_6e0._4_4_;
        auVar217._8_4_ = fVar236 + local_6e0._8_4_;
        auVar217._12_4_ = fVar237 + local_6e0._12_4_;
        auVar217._16_4_ = fVar238 + local_6e0._16_4_;
        auVar217._20_4_ = fVar159 + local_6e0._20_4_;
        auVar217._24_4_ = fVar239 + local_6e0._24_4_;
        auVar217._28_4_ = fVar240 + local_6e0._28_4_;
        uVar21 = vcmpps_avx512vl(auVar217,auVar175,2);
        bVar74 = bVar74 & (byte)uVar22 & (byte)uVar21 | bVar78;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar177 = ZEXT3264(auVar106);
        prim = local_910;
        if (bVar74 != 0) {
          abStack_1a0[uVar79 * 0x60] = bVar74;
          auVar148._0_4_ =
               (uint)(bVar78 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar78 & 1) * (int)local_6e0._0_4_;
          bVar6 = (bool)(bVar78 >> 1 & 1);
          auVar148._4_4_ = (uint)bVar6 * local_540._4_4_ | (uint)!bVar6 * (int)local_6e0._4_4_;
          bVar6 = (bool)(bVar78 >> 2 & 1);
          auVar148._8_4_ = (uint)bVar6 * (int)fStack_538 | (uint)!bVar6 * (int)local_6e0._8_4_;
          bVar6 = (bool)(bVar78 >> 3 & 1);
          auVar148._12_4_ = (uint)bVar6 * (int)fStack_534 | (uint)!bVar6 * (int)local_6e0._12_4_;
          bVar6 = (bool)(bVar78 >> 4 & 1);
          auVar148._16_4_ = (uint)bVar6 * (int)fStack_530 | (uint)!bVar6 * (int)local_6e0._16_4_;
          bVar6 = (bool)(bVar78 >> 5 & 1);
          auVar148._20_4_ = (uint)bVar6 * (int)fStack_52c | (uint)!bVar6 * (int)local_6e0._20_4_;
          auVar148._24_4_ =
               (uint)(bVar78 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar78 >> 6) * (int)local_6e0._24_4_;
          auVar148._28_4_ = local_6e0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar148;
          uVar85 = vmovlps_avx(local_710);
          (&uStack_160)[uVar79 * 0xc] = uVar85;
          aiStack_158[uVar79 * 0x18] = iVar80 + 1;
          uVar79 = (ulong)((int)uVar79 + 1);
        }
      }
    }
    do {
      uVar87 = (uint)uVar79;
      uVar79 = (ulong)(uVar87 - 1);
      if (uVar87 == 0) {
        uVar179 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar179;
        auVar34._0_4_ = uVar179;
        auVar34._8_4_ = uVar179;
        auVar34._12_4_ = uVar179;
        uVar21 = vcmpps_avx512vl(local_720,auVar34,2);
        uVar82 = (uint)local_908 & (uint)uVar21;
        local_908 = (ulong)uVar82;
        if (uVar82 == 0) {
          return;
        }
        goto LAB_01ac7131;
      }
      lVar83 = uVar79 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_180 + lVar83);
      auVar197._0_4_ = fVar218 + auVar106._0_4_;
      auVar197._4_4_ = fVar235 + auVar106._4_4_;
      auVar197._8_4_ = fVar236 + auVar106._8_4_;
      auVar197._12_4_ = fVar237 + auVar106._12_4_;
      auVar197._16_4_ = fVar238 + auVar106._16_4_;
      auVar197._20_4_ = fVar159 + auVar106._20_4_;
      auVar197._24_4_ = fVar239 + auVar106._24_4_;
      auVar197._28_4_ = fVar240 + auVar106._28_4_;
      uVar179 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar39._4_4_ = uVar179;
      auVar39._0_4_ = uVar179;
      auVar39._8_4_ = uVar179;
      auVar39._12_4_ = uVar179;
      auVar39._16_4_ = uVar179;
      auVar39._20_4_ = uVar179;
      auVar39._24_4_ = uVar179;
      auVar39._28_4_ = uVar179;
      uVar21 = vcmpps_avx512vl(auVar197,auVar39,2);
      uVar86 = (uint)uVar21 & (uint)abStack_1a0[lVar83];
    } while (uVar86 == 0);
    uVar85 = (&uStack_160)[uVar79 * 0xc];
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar85;
    auVar215._8_4_ = 0x7f800000;
    auVar215._0_8_ = 0x7f8000007f800000;
    auVar215._12_4_ = 0x7f800000;
    auVar215._16_4_ = 0x7f800000;
    auVar215._20_4_ = 0x7f800000;
    auVar215._24_4_ = 0x7f800000;
    auVar215._28_4_ = 0x7f800000;
    auVar107 = vblendmps_avx512vl(auVar215,auVar106);
    bVar74 = (byte)uVar86;
    auVar144._0_4_ =
         (uint)(bVar74 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar106._0_4_;
    bVar6 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar144._4_4_ = (uint)bVar6 * auVar107._4_4_ | (uint)!bVar6 * (int)auVar106._4_4_;
    bVar6 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar144._8_4_ = (uint)bVar6 * auVar107._8_4_ | (uint)!bVar6 * (int)auVar106._8_4_;
    bVar6 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar144._12_4_ = (uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * (int)auVar106._12_4_;
    bVar6 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar144._16_4_ = (uint)bVar6 * auVar107._16_4_ | (uint)!bVar6 * (int)auVar106._16_4_;
    bVar6 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar144._20_4_ = (uint)bVar6 * auVar107._20_4_ | (uint)!bVar6 * (int)auVar106._20_4_;
    bVar6 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar144._24_4_ = (uint)bVar6 * auVar107._24_4_ | (uint)!bVar6 * (int)auVar106._24_4_;
    auVar144._28_4_ =
         (uVar86 >> 7) * auVar107._28_4_ | (uint)!SUB41(uVar86 >> 7,0) * (int)auVar106._28_4_;
    auVar106 = vshufps_avx(auVar144,auVar144,0xb1);
    auVar106 = vminps_avx(auVar144,auVar106);
    auVar107 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar107);
    auVar107 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar107);
    uVar21 = vcmpps_avx512vl(auVar144,auVar106,0);
    bVar77 = (byte)uVar21 & bVar74;
    if (bVar77 != 0) {
      uVar86 = (uint)bVar77;
    }
    uVar152 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      uVar152 = uVar152 + 1;
    }
    iVar80 = aiStack_158[uVar79 * 0x18];
    bVar74 = ~('\x01' << ((byte)uVar152 & 0x1f)) & bVar74;
    abStack_1a0[lVar83] = bVar74;
    if (bVar74 == 0) {
      uVar87 = uVar87 - 1;
    }
    uVar179 = (undefined4)uVar85;
    auVar171._4_4_ = uVar179;
    auVar171._0_4_ = uVar179;
    auVar171._8_4_ = uVar179;
    auVar171._12_4_ = uVar179;
    auVar171._16_4_ = uVar179;
    auVar171._20_4_ = uVar179;
    auVar171._24_4_ = uVar179;
    auVar171._28_4_ = uVar179;
    auVar93 = vmovshdup_avx(auVar182);
    auVar93 = vsubps_avx(auVar93,auVar182);
    auVar198._0_4_ = auVar93._0_4_;
    auVar198._4_4_ = auVar198._0_4_;
    auVar198._8_4_ = auVar198._0_4_;
    auVar198._12_4_ = auVar198._0_4_;
    auVar198._16_4_ = auVar198._0_4_;
    auVar198._20_4_ = auVar198._0_4_;
    auVar198._24_4_ = auVar198._0_4_;
    auVar198._28_4_ = auVar198._0_4_;
    auVar93 = vfmadd132ps_fma(auVar198,auVar171,_DAT_01faff20);
    auVar106 = ZEXT1632(auVar93);
    local_400[0] = (RTCHitN)auVar106[0];
    local_400[1] = (RTCHitN)auVar106[1];
    local_400[2] = (RTCHitN)auVar106[2];
    local_400[3] = (RTCHitN)auVar106[3];
    local_400[4] = (RTCHitN)auVar106[4];
    local_400[5] = (RTCHitN)auVar106[5];
    local_400[6] = (RTCHitN)auVar106[6];
    local_400[7] = (RTCHitN)auVar106[7];
    local_400[8] = (RTCHitN)auVar106[8];
    local_400[9] = (RTCHitN)auVar106[9];
    local_400[10] = (RTCHitN)auVar106[10];
    local_400[0xb] = (RTCHitN)auVar106[0xb];
    local_400[0xc] = (RTCHitN)auVar106[0xc];
    local_400[0xd] = (RTCHitN)auVar106[0xd];
    local_400[0xe] = (RTCHitN)auVar106[0xe];
    local_400[0xf] = (RTCHitN)auVar106[0xf];
    local_400[0x10] = (RTCHitN)auVar106[0x10];
    local_400[0x11] = (RTCHitN)auVar106[0x11];
    local_400[0x12] = (RTCHitN)auVar106[0x12];
    local_400[0x13] = (RTCHitN)auVar106[0x13];
    local_400[0x14] = (RTCHitN)auVar106[0x14];
    local_400[0x15] = (RTCHitN)auVar106[0x15];
    local_400[0x16] = (RTCHitN)auVar106[0x16];
    local_400[0x17] = (RTCHitN)auVar106[0x17];
    local_400[0x18] = (RTCHitN)auVar106[0x18];
    local_400[0x19] = (RTCHitN)auVar106[0x19];
    local_400[0x1a] = (RTCHitN)auVar106[0x1a];
    local_400[0x1b] = (RTCHitN)auVar106[0x1b];
    local_400[0x1c] = (RTCHitN)auVar106[0x1c];
    local_400[0x1d] = (RTCHitN)auVar106[0x1d];
    local_400[0x1e] = (RTCHitN)auVar106[0x1e];
    local_400[0x1f] = (RTCHitN)auVar106[0x1f];
    local_710._8_8_ = 0;
    local_710._0_8_ = *(ulong *)(local_400 + (ulong)uVar152 * 4);
    uVar79 = (ulong)uVar87;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }